

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::avx::SubGridMBIntersectorKPluecker<4,_4,_true>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  ushort uVar1;
  Geometry *pGVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  size_t k;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  byte bVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  byte bVar60;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  RayK<4> *pRVar65;
  RayQueryContext *pRVar66;
  uint uVar67;
  undefined4 uVar68;
  int iVar69;
  AABBNodeMB4D *node1;
  ulong uVar70;
  long lVar71;
  long lVar72;
  long lVar73;
  long lVar74;
  long lVar75;
  ulong uVar76;
  undefined1 (*pauVar77) [16];
  ulong uVar78;
  NodeRef NVar79;
  undefined8 in_R11;
  ulong *puVar80;
  long lVar81;
  ulong uVar82;
  bool bVar83;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  float fVar110;
  float fVar123;
  float fVar124;
  vint4 ai_2;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar125;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  vint4 bi_1;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar152;
  float fVar153;
  vint4 bi_3;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  float fVar154;
  float fVar158;
  float fVar159;
  undefined1 auVar151 [32];
  vint4 bi;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  float fVar173;
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  vint4 bi_2;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar184;
  float fVar185;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar190 [32];
  float fVar203;
  float fVar209;
  float fVar210;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar212;
  float fVar213;
  float fVar214;
  undefined1 auVar206 [32];
  float fVar211;
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar215;
  float fVar216;
  float fVar221;
  float fVar222;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  undefined1 auVar219 [32];
  float fVar223;
  float fVar227;
  undefined1 auVar220 [32];
  float fVar228;
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar229 [32];
  undefined1 auVar236 [32];
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  vint4 ai;
  undefined1 auVar240 [16];
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  float fVar259;
  undefined1 auVar241 [32];
  vint4 ai_1;
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  float fVar262;
  float fVar265;
  float fVar266;
  vint4 ai_3;
  undefined1 auVar263 [16];
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar264 [32];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  Precalculations pre;
  UVIdentity<8> mapUV;
  vbool<4> terminated;
  float old_t;
  vbool<4> valid0;
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  vint<4> itime;
  vfloat<4> ftime;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  Precalculations local_1dda;
  undefined1 local_1dd9;
  undefined1 (*local_1dd8) [16];
  NodeRef local_1dd0;
  ulong *local_1dc8;
  uint local_1dbc;
  uint local_1db8;
  uint local_1db4;
  undefined1 local_1db0 [16];
  undefined1 local_1da0 [16];
  ulong local_1d90;
  RayK<4> *local_1d88;
  long local_1d80;
  ulong local_1d78;
  undefined1 local_1d70 [16];
  undefined1 local_1d60 [32];
  undefined1 local_1d40 [32];
  undefined1 local_1d20 [32];
  undefined1 local_1d00 [16];
  BVH *local_1ce8;
  Intersectors *local_1ce0;
  long local_1cd8;
  long local_1cd0;
  ulong local_1cc8;
  RayK<4> *local_1cc0;
  RayQueryContext *local_1cb8;
  ulong local_1cb0;
  ulong local_1ca8;
  ulong local_1ca0;
  long local_1c98;
  long local_1c90;
  Scene *local_1c88;
  undefined1 local_1c80 [8];
  float fStack_1c78;
  float fStack_1c74;
  float fStack_1c70;
  float fStack_1c6c;
  float fStack_1c68;
  float fStack_1c64;
  undefined1 local_1c50 [16];
  RTCFilterFunctionNArguments local_1c40;
  anon_union_48_2_4062524c_for_Vec3<embree::vfloat_impl<4>_>_1 local_1c10;
  undefined1 local_1be0 [16];
  undefined1 local_1bd0 [16];
  undefined1 local_1bc0 [16];
  undefined1 local_1bb0 [16];
  undefined1 local_1ba0 [8];
  float fStack_1b98;
  float fStack_1b94;
  undefined1 local_1b90 [8];
  float fStack_1b88;
  float fStack_1b84;
  undefined1 local_1b80 [16];
  undefined1 local_1b70 [16];
  undefined1 local_1b60 [16];
  undefined1 local_1b50 [16];
  undefined1 local_1b40 [16];
  float local_1b30 [4];
  undefined1 local_1b20 [16];
  undefined1 local_1b10 [16];
  undefined4 local_1b00;
  undefined4 uStack_1afc;
  undefined4 uStack_1af8;
  undefined4 uStack_1af4;
  undefined1 local_1af0 [16];
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined1 local_1ad0 [16];
  uint local_1ac0;
  uint uStack_1abc;
  uint uStack_1ab8;
  uint uStack_1ab4;
  uint uStack_1ab0;
  uint uStack_1aac;
  uint uStack_1aa8;
  uint uStack_1aa4;
  undefined1 local_1aa0 [16];
  undefined1 local_1a90 [16];
  undefined1 local_1a80 [16];
  float local_1a70;
  float fStack_1a6c;
  float fStack_1a68;
  float fStack_1a64;
  undefined1 local_1a60 [16];
  undefined1 local_1a50 [16];
  float local_1a40 [4];
  float fStack_1a30;
  float fStack_1a2c;
  float fStack_1a28;
  float fStack_1a24;
  undefined1 local_1a20 [32];
  undefined1 local_1a00 [32];
  undefined1 *local_19e0;
  undefined1 local_19c0 [32];
  undefined1 local_19a0 [32];
  undefined1 local_1980 [32];
  undefined1 local_1960 [32];
  float local_1940 [4];
  float fStack_1930;
  float fStack_192c;
  float fStack_1928;
  undefined4 uStack_1924;
  float local_1920 [4];
  float fStack_1910;
  float fStack_190c;
  float fStack_1908;
  undefined4 uStack_1904;
  float local_1900 [4];
  float fStack_18f0;
  float fStack_18ec;
  float fStack_18e8;
  undefined4 uStack_18e4;
  undefined1 local_18e0 [8];
  float fStack_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  float fStack_18c8;
  undefined1 local_18c0 [32];
  undefined1 local_18a0 [32];
  undefined1 local_1880 [8];
  float fStack_1878;
  float fStack_1874;
  float fStack_1870;
  float fStack_186c;
  float fStack_1868;
  undefined1 local_1860 [8];
  float fStack_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float fStack_1848;
  undefined1 local_1840 [32];
  undefined1 local_1820 [32];
  undefined1 local_1800 [32];
  undefined1 local_17e0 [32];
  undefined1 local_17c0 [32];
  undefined1 local_17a0 [32];
  undefined1 local_1780 [32];
  undefined1 local_1760 [32];
  undefined1 local_1740 [32];
  undefined1 local_1720 [32];
  undefined8 local_1700;
  size_t local_16f8;
  ulong local_16f0 [240];
  undefined4 local_f70;
  undefined4 uStack_f6c;
  undefined4 uStack_f68;
  undefined4 uStack_f64;
  undefined1 local_f60 [16];
  undefined1 local_f50 [3872];
  
  local_1ce8 = (BVH *)This->ptr;
  local_16f8 = (local_1ce8->root).ptr;
  if (local_16f8 != 8) {
    auVar85 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar100 = vpcmpeqd_avx(auVar85,(undefined1  [16])valid_i->field_0);
    auVar111 = ZEXT816(0) << 0x40;
    auVar92 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar111,5);
    auVar99 = auVar100 & auVar92;
    if ((((auVar99 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar99 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar99 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar99[0xf] < '\0')
    {
      local_1aa0 = vandps_avx(auVar92,auVar100);
      local_1c10._0_8_ = *(undefined8 *)ray;
      local_1c10._8_8_ = *(undefined8 *)(ray + 8);
      local_1c10._16_8_ = *(undefined8 *)(ray + 0x10);
      local_1c10._24_8_ = *(undefined8 *)(ray + 0x18);
      local_1c10._32_8_ = *(undefined8 *)(ray + 0x20);
      local_1c10._40_8_ = *(undefined8 *)(ray + 0x28);
      local_1be0 = *(undefined1 (*) [16])(ray + 0x40);
      local_1bd0 = *(undefined1 (*) [16])(ray + 0x50);
      local_1bc0 = *(undefined1 (*) [16])(ray + 0x60);
      auVar174._8_4_ = 0x7fffffff;
      auVar174._0_8_ = 0x7fffffff7fffffff;
      auVar174._12_4_ = 0x7fffffff;
      auVar92 = vandps_avx(local_1be0,auVar174);
      auVar204._8_4_ = 0x219392ef;
      auVar204._0_8_ = 0x219392ef219392ef;
      auVar204._12_4_ = 0x219392ef;
      auVar100 = vcmpps_avx(auVar92,auVar204,1);
      auVar217._8_4_ = 0x3f800000;
      auVar217._0_8_ = 0x3f8000003f800000;
      auVar217._12_4_ = 0x3f800000;
      auVar139 = vdivps_avx(auVar217,local_1be0);
      auVar92 = vandps_avx(local_1bd0,auVar174);
      auVar99 = vcmpps_avx(auVar92,auVar204,1);
      auVar160 = vdivps_avx(auVar217,local_1bd0);
      auVar92 = vandps_avx(local_1bc0,auVar174);
      auVar92 = vcmpps_avx(auVar92,auVar204,1);
      auVar174 = vdivps_avx(auVar217,local_1bc0);
      auVar205._8_4_ = 0x5d5e0b6b;
      auVar205._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar205._12_4_ = 0x5d5e0b6b;
      local_1bb0 = vblendvps_avx(auVar139,auVar205,auVar100);
      _local_1ba0 = vblendvps_avx(auVar160,auVar205,auVar99);
      _local_1b90 = vblendvps_avx(auVar174,auVar205,auVar92);
      auVar92 = vcmpps_avx(local_1bb0,auVar111,1);
      auVar175._8_4_ = 0x10;
      auVar175._0_8_ = 0x1000000010;
      auVar175._12_4_ = 0x10;
      local_1b80 = vandps_avx(auVar92,auVar175);
      auVar92 = vcmpps_avx(_local_1ba0,auVar111,5);
      auVar100._8_4_ = 0x20;
      auVar100._0_8_ = 0x2000000020;
      auVar100._12_4_ = 0x20;
      auVar176._8_4_ = 0x30;
      auVar176._0_8_ = 0x3000000030;
      auVar176._12_4_ = 0x30;
      local_1b70 = vblendvps_avx(auVar176,auVar100,auVar92);
      auVar92 = vcmpps_avx(_local_1b90,auVar111,5);
      auVar139._8_4_ = 0x40;
      auVar139._0_8_ = 0x4000000040;
      auVar139._12_4_ = 0x40;
      auVar160._8_4_ = 0x50;
      auVar160._0_8_ = 0x5000000050;
      auVar160._12_4_ = 0x50;
      local_1b60 = vblendvps_avx(auVar160,auVar139,auVar92);
      auVar92 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar111);
      auVar100 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar111);
      auVar99._8_4_ = 0x7f800000;
      auVar99._0_8_ = 0x7f8000007f800000;
      auVar99._12_4_ = 0x7f800000;
      local_1b50 = vblendvps_avx(auVar99,auVar92,local_1aa0);
      auVar92._8_4_ = 0xff800000;
      auVar92._0_8_ = 0xff800000ff800000;
      auVar92._12_4_ = 0xff800000;
      local_1b40 = vblendvps_avx(auVar92,auVar100,local_1aa0);
      local_1db0._4_4_ = local_1aa0._4_4_ ^ auVar85._4_4_;
      local_1db0._0_4_ = local_1aa0._0_4_ ^ auVar85._0_4_;
      local_1db0._8_4_ = local_1aa0._8_4_ ^ auVar85._8_4_;
      local_1db0._12_4_ = local_1aa0._12_4_ ^ auVar85._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        local_1d90 = 3;
      }
      else {
        local_1d90 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                            RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1d88 = ray + 0x80;
      local_1700 = 0xfffffffffffffff8;
      local_f70 = 0x7f800000;
      uStack_f6c = 0x7f800000;
      uStack_f68 = 0x7f800000;
      uStack_f64 = 0x7f800000;
      local_f60 = local_1b50;
      local_18c0._16_16_ = mm_lookupmask_ps._240_16_;
      local_18c0._0_16_ = mm_lookupmask_ps._0_16_;
      bVar60 = (byte)local_1d90;
      auVar121._8_4_ = 0x3f800000;
      auVar121._0_8_ = 0x3f8000003f800000;
      auVar121._12_4_ = 0x3f800000;
      auVar121._16_4_ = 0x3f800000;
      auVar121._20_4_ = 0x3f800000;
      auVar121._24_4_ = 0x3f800000;
      auVar121._28_4_ = 0x3f800000;
      auVar95._8_4_ = 0xbf800000;
      auVar95._0_8_ = 0xbf800000bf800000;
      auVar95._12_4_ = 0xbf800000;
      auVar95._16_4_ = 0xbf800000;
      auVar95._20_4_ = 0xbf800000;
      auVar95._24_4_ = 0xbf800000;
      auVar95._28_4_ = 0xbf800000;
      _local_18e0 = vblendvps_avx(auVar121,auVar95,local_18c0);
      pauVar77 = (undefined1 (*) [16])local_f50;
      puVar80 = local_16f0;
      local_1ce0 = This;
      local_1cc0 = ray;
      local_1cb8 = context;
LAB_00ed4c1e:
      do {
        do {
          local_1dd0.ptr = puVar80[-1];
          if (local_1dd0.ptr == 0xfffffffffffffff8) goto LAB_00ed617f;
          local_1dc8 = puVar80 + -1;
          local_1dd8 = pauVar77 + -1;
          auVar92 = *local_1dd8;
          auVar85 = vcmpps_avx(auVar92,local_1b40,1);
          uVar67 = vmovmskps_avx(auVar85);
          pauVar77 = local_1dd8;
          puVar80 = local_1dc8;
        } while (uVar67 == 0);
        uVar82 = (ulong)(uVar67 & 0xff);
        uVar70 = (ulong)(uint)POPCOUNT(uVar67 & 0xff);
        if (local_1d90 < uVar70) {
LAB_00ed4c69:
          auVar109 = ZEXT1664(auVar92);
          pauVar77 = local_1dd8;
          do {
            uVar67 = (uint)local_1dd0.ptr;
            if ((local_1dd0.ptr & 8) != 0) {
              if (local_1dd0.ptr == 0xfffffffffffffff8) goto LAB_00ed617f;
              auVar92 = vcmpps_avx(local_1b40,auVar109._0_16_,6);
              if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar92[0xf] < '\0') {
                local_1cd8 = (ulong)(uVar67 & 0xf) - 8;
                NVar79.ptr = local_1dd0.ptr & 0xfffffffffffffff0;
                auVar92 = vpcmpeqd_avx(auVar92,auVar92);
                lVar74 = 0;
                auVar92 = auVar92 ^ local_1db0;
                local_1dd8 = pauVar77;
                local_1dd0.ptr = NVar79.ptr;
                local_1dc8 = puVar80;
                while (lVar74 != local_1cd8) {
                  lVar71 = lVar74 * 0x90;
                  auVar84._8_8_ = 0;
                  auVar84._0_8_ = *(ulong *)(NVar79.ptr + 0x20 + lVar71);
                  auVar101._8_8_ = 0;
                  auVar101._0_8_ = *(ulong *)(NVar79.ptr + 0x24 + lVar71);
                  auVar100 = vpminub_avx(auVar84,auVar101);
                  auVar85 = vpcmpeqb_avx(auVar84,auVar100);
                  auVar100 = vpcmpeqd_avx(auVar100,auVar100);
                  auVar109 = ZEXT1664(auVar100);
                  auVar85 = vpmovzxbd_avx(auVar85 ^ auVar100);
                  auVar85 = vpslld_avx(auVar85 ^ auVar100,0x1f);
                  uVar67 = vmovmskps_avx(auVar85);
                  local_1d70 = auVar92;
                  local_1cd0 = lVar74;
                  if (uVar67 != 0) {
                    lVar74 = NVar79.ptr + lVar71;
                    uVar68 = *(undefined4 *)(NVar79.ptr + 0x80 + lVar71);
                    auVar86._4_4_ = uVar68;
                    auVar86._0_4_ = uVar68;
                    auVar86._8_4_ = uVar68;
                    auVar86._12_4_ = uVar68;
                    auVar92 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar86);
                    fVar184 = *(float *)(NVar79.ptr + 0x84 + lVar71);
                    local_1a70 = fVar184 * auVar92._0_4_;
                    fStack_1a6c = fVar184 * auVar92._4_4_;
                    fStack_1a68 = fVar184 * auVar92._8_4_;
                    fStack_1a64 = fVar184 * auVar92._12_4_;
                    uVar70 = (ulong)(uVar67 & 0xff);
                    local_1d80 = lVar74;
                    do {
                      lVar71 = 0;
                      if (uVar70 != 0) {
                        for (; (uVar70 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
                        }
                      }
                      auVar87._8_8_ = 0;
                      auVar87._0_8_ = *(ulong *)(lVar74 + 0x20);
                      auVar92 = vpmovzxbd_avx(auVar87);
                      auVar92 = vcvtdq2ps_avx(auVar92);
                      fVar184 = *(float *)(lVar74 + 0x44);
                      fVar191 = *(float *)(lVar74 + 0x38);
                      local_1a40[0] = fVar191 + fVar184 * auVar92._0_4_;
                      local_1a40[1] = fVar191 + fVar184 * auVar92._4_4_;
                      local_1a40[2] = fVar191 + fVar184 * auVar92._8_4_;
                      local_1a40[3] = fVar191 + fVar184 * auVar92._12_4_;
                      fVar124 = local_1a40[lVar71];
                      auVar132._8_8_ = 0;
                      auVar132._0_8_ = *(ulong *)(lVar74 + 0x50);
                      auVar92 = vpmovzxbd_avx(auVar132);
                      auVar92 = vcvtdq2ps_avx(auVar92);
                      fVar125 = *(float *)(lVar74 + 0x74);
                      fVar126 = *(float *)(lVar74 + 0x68);
                      local_1b30[0] = fVar126 + fVar125 * auVar92._0_4_;
                      local_1b30[1] = fVar126 + fVar125 * auVar92._4_4_;
                      local_1b30[2] = fVar126 + fVar125 * auVar92._8_4_;
                      local_1b30[3] = fVar126 + fVar125 * auVar92._12_4_;
                      auVar92 = vshufps_avx(ZEXT416((uint)(local_1b30[lVar71] - fVar124)),
                                            ZEXT416((uint)(local_1b30[lVar71] - fVar124)),0);
                      auVar88._0_4_ = fVar124 + local_1a70 * auVar92._0_4_;
                      auVar88._4_4_ = fVar124 + fStack_1a6c * auVar92._4_4_;
                      auVar88._8_4_ = fVar124 + fStack_1a68 * auVar92._8_4_;
                      auVar88._12_4_ = fVar124 + fStack_1a64 * auVar92._12_4_;
                      auVar133._8_8_ = 0;
                      auVar133._0_8_ = *(ulong *)(lVar74 + 0x24);
                      auVar92 = vpmovzxbd_avx(auVar133);
                      auVar92 = vcvtdq2ps_avx(auVar92);
                      local_1a40[0] = fVar191 + fVar184 * auVar92._0_4_;
                      local_1a40[1] = fVar191 + fVar184 * auVar92._4_4_;
                      local_1a40[2] = fVar191 + fVar184 * auVar92._8_4_;
                      local_1a40[3] = fVar191 + fVar184 * auVar92._12_4_;
                      fVar184 = local_1a40[lVar71];
                      auVar114._8_8_ = 0;
                      auVar114._0_8_ = *(ulong *)(lVar74 + 0x54);
                      auVar92 = vpmovzxbd_avx(auVar114);
                      auVar92 = vcvtdq2ps_avx(auVar92);
                      local_1b30[0] = fVar126 + fVar125 * auVar92._0_4_;
                      local_1b30[1] = fVar126 + fVar125 * auVar92._4_4_;
                      local_1b30[2] = fVar126 + fVar125 * auVar92._8_4_;
                      local_1b30[3] = fVar126 + fVar125 * auVar92._12_4_;
                      auVar92 = vshufps_avx(ZEXT416((uint)(local_1b30[lVar71] - fVar184)),
                                            ZEXT416((uint)(local_1b30[lVar71] - fVar184)),0);
                      auVar102._0_4_ = fVar184 + local_1a70 * auVar92._0_4_;
                      auVar102._4_4_ = fVar184 + fStack_1a6c * auVar92._4_4_;
                      auVar102._8_4_ = fVar184 + fStack_1a68 * auVar92._8_4_;
                      auVar102._12_4_ = fVar184 + fStack_1a64 * auVar92._12_4_;
                      auVar115._8_8_ = 0;
                      auVar115._0_8_ = *(ulong *)(lVar74 + 0x28);
                      auVar92 = vpmovzxbd_avx(auVar115);
                      auVar92 = vcvtdq2ps_avx(auVar92);
                      fVar184 = *(float *)(lVar74 + 0x48);
                      fVar191 = *(float *)(lVar74 + 0x3c);
                      local_1a40[0] = fVar191 + fVar184 * auVar92._0_4_;
                      local_1a40[1] = fVar191 + fVar184 * auVar92._4_4_;
                      local_1a40[2] = fVar191 + fVar184 * auVar92._8_4_;
                      local_1a40[3] = fVar191 + fVar184 * auVar92._12_4_;
                      fVar124 = local_1a40[lVar71];
                      auVar164._8_8_ = 0;
                      auVar164._0_8_ = *(ulong *)(lVar74 + 0x58);
                      auVar92 = vpmovzxbd_avx(auVar164);
                      auVar92 = vcvtdq2ps_avx(auVar92);
                      fVar125 = *(float *)(lVar74 + 0x78);
                      fVar126 = *(float *)(lVar74 + 0x6c);
                      local_1b30[0] = fVar126 + fVar125 * auVar92._0_4_;
                      local_1b30[1] = fVar126 + fVar125 * auVar92._4_4_;
                      local_1b30[2] = fVar126 + fVar125 * auVar92._8_4_;
                      local_1b30[3] = fVar126 + fVar125 * auVar92._12_4_;
                      auVar92 = vshufps_avx(ZEXT416((uint)(local_1b30[lVar71] - fVar124)),
                                            ZEXT416((uint)(local_1b30[lVar71] - fVar124)),0);
                      auVar116._0_4_ = fVar124 + local_1a70 * auVar92._0_4_;
                      auVar116._4_4_ = fVar124 + fStack_1a6c * auVar92._4_4_;
                      auVar116._8_4_ = fVar124 + fStack_1a68 * auVar92._8_4_;
                      auVar116._12_4_ = fVar124 + fStack_1a64 * auVar92._12_4_;
                      auVar165._8_8_ = 0;
                      auVar165._0_8_ = *(ulong *)(lVar74 + 0x2c);
                      auVar92 = vpmovzxbd_avx(auVar165);
                      auVar92 = vcvtdq2ps_avx(auVar92);
                      local_1a40[0] = fVar191 + fVar184 * auVar92._0_4_;
                      local_1a40[1] = fVar191 + fVar184 * auVar92._4_4_;
                      local_1a40[2] = fVar191 + fVar184 * auVar92._8_4_;
                      local_1a40[3] = fVar191 + fVar184 * auVar92._12_4_;
                      fVar184 = local_1a40[lVar71];
                      auVar144._8_8_ = 0;
                      auVar144._0_8_ = *(ulong *)(lVar74 + 0x5c);
                      auVar92 = vpmovzxbd_avx(auVar144);
                      auVar92 = vcvtdq2ps_avx(auVar92);
                      local_1b30[0] = fVar126 + fVar125 * auVar92._0_4_;
                      local_1b30[1] = fVar126 + fVar125 * auVar92._4_4_;
                      local_1b30[2] = fVar126 + fVar125 * auVar92._8_4_;
                      local_1b30[3] = fVar126 + fVar125 * auVar92._12_4_;
                      auVar92 = vshufps_avx(ZEXT416((uint)(local_1b30[lVar71] - fVar184)),
                                            ZEXT416((uint)(local_1b30[lVar71] - fVar184)),0);
                      auVar134._0_4_ = fVar184 + local_1a70 * auVar92._0_4_;
                      auVar134._4_4_ = fVar184 + fStack_1a6c * auVar92._4_4_;
                      auVar134._8_4_ = fVar184 + fStack_1a68 * auVar92._8_4_;
                      auVar134._12_4_ = fVar184 + fStack_1a64 * auVar92._12_4_;
                      auVar145._8_8_ = 0;
                      auVar145._0_8_ = *(ulong *)(lVar74 + 0x30);
                      auVar92 = vpmovzxbd_avx(auVar145);
                      auVar92 = vcvtdq2ps_avx(auVar92);
                      fVar184 = *(float *)(lVar74 + 0x4c);
                      fVar191 = *(float *)(lVar74 + 0x40);
                      local_1a40[0] = fVar191 + fVar184 * auVar92._0_4_;
                      local_1a40[1] = fVar191 + fVar184 * auVar92._4_4_;
                      local_1a40[2] = fVar191 + fVar184 * auVar92._8_4_;
                      local_1a40[3] = fVar191 + fVar184 * auVar92._12_4_;
                      fVar124 = local_1a40[lVar71];
                      auVar187._8_8_ = 0;
                      auVar187._0_8_ = *(ulong *)(lVar74 + 0x60);
                      auVar92 = vpmovzxbd_avx(auVar187);
                      auVar92 = vcvtdq2ps_avx(auVar92);
                      fVar125 = *(float *)(lVar74 + 0x7c);
                      fVar126 = *(float *)(lVar74 + 0x70);
                      local_1b30[0] = fVar126 + fVar125 * auVar92._0_4_;
                      local_1b30[1] = fVar126 + fVar125 * auVar92._4_4_;
                      local_1b30[2] = fVar126 + fVar125 * auVar92._8_4_;
                      local_1b30[3] = fVar126 + fVar125 * auVar92._12_4_;
                      auVar92 = vshufps_avx(ZEXT416((uint)(local_1b30[lVar71] - fVar124)),
                                            ZEXT416((uint)(local_1b30[lVar71] - fVar124)),0);
                      auVar146._0_4_ = fVar124 + local_1a70 * auVar92._0_4_;
                      auVar146._4_4_ = fVar124 + fStack_1a6c * auVar92._4_4_;
                      auVar146._8_4_ = fVar124 + fStack_1a68 * auVar92._8_4_;
                      auVar146._12_4_ = fVar124 + fStack_1a64 * auVar92._12_4_;
                      auVar188._8_8_ = 0;
                      auVar188._0_8_ = *(ulong *)(lVar74 + 0x34);
                      auVar92 = vpmovzxbd_avx(auVar188);
                      auVar92 = vcvtdq2ps_avx(auVar92);
                      local_1a40[0] = fVar191 + fVar184 * auVar92._0_4_;
                      local_1a40[1] = fVar191 + fVar184 * auVar92._4_4_;
                      local_1a40[2] = fVar191 + fVar184 * auVar92._8_4_;
                      local_1a40[3] = fVar191 + fVar184 * auVar92._12_4_;
                      fVar184 = local_1a40[lVar71];
                      auVar178._8_8_ = 0;
                      auVar178._0_8_ = *(ulong *)(lVar74 + 100);
                      auVar92 = vpmovzxbd_avx(auVar178);
                      auVar92 = vcvtdq2ps_avx(auVar92);
                      local_1b30[0] = fVar126 + fVar125 * auVar92._0_4_;
                      local_1b30[1] = fVar126 + fVar125 * auVar92._4_4_;
                      local_1b30[2] = fVar126 + fVar125 * auVar92._8_4_;
                      local_1b30[3] = fVar126 + fVar125 * auVar92._12_4_;
                      auVar92 = vshufps_avx(ZEXT416((uint)(local_1b30[lVar71] - fVar184)),
                                            ZEXT416((uint)(local_1b30[lVar71] - fVar184)),0);
                      auVar166._0_4_ = fVar184 + local_1a70 * auVar92._0_4_;
                      auVar166._4_4_ = fVar184 + fStack_1a6c * auVar92._4_4_;
                      auVar166._8_4_ = fVar184 + fStack_1a68 * auVar92._8_4_;
                      auVar166._12_4_ = fVar184 + fStack_1a64 * auVar92._12_4_;
                      auVar61._8_8_ = local_1c10._8_8_;
                      auVar61._0_8_ = local_1c10._0_8_;
                      auVar62._8_8_ = local_1c10._24_8_;
                      auVar62._0_8_ = local_1c10._16_8_;
                      auVar64._8_8_ = local_1c10._40_8_;
                      auVar64._0_8_ = local_1c10._32_8_;
                      auVar92 = vsubps_avx(auVar88,auVar61);
                      auVar89._0_4_ = local_1bb0._0_4_ * auVar92._0_4_;
                      auVar89._4_4_ = local_1bb0._4_4_ * auVar92._4_4_;
                      auVar89._8_4_ = local_1bb0._8_4_ * auVar92._8_4_;
                      auVar89._12_4_ = local_1bb0._12_4_ * auVar92._12_4_;
                      auVar92 = vsubps_avx(auVar116,auVar62);
                      auVar117._0_4_ = local_1ba0._0_4_ * auVar92._0_4_;
                      auVar117._4_4_ = local_1ba0._4_4_ * auVar92._4_4_;
                      auVar117._8_4_ = local_1ba0._8_4_ * auVar92._8_4_;
                      auVar117._12_4_ = local_1ba0._12_4_ * auVar92._12_4_;
                      auVar92 = vsubps_avx(auVar146,auVar64);
                      auVar147._0_4_ = local_1b90._0_4_ * auVar92._0_4_;
                      auVar147._4_4_ = local_1b90._4_4_ * auVar92._4_4_;
                      auVar147._8_4_ = local_1b90._8_4_ * auVar92._8_4_;
                      auVar147._12_4_ = local_1b90._12_4_ * auVar92._12_4_;
                      auVar92 = vsubps_avx(auVar102,auVar61);
                      auVar103._0_4_ = local_1bb0._0_4_ * auVar92._0_4_;
                      auVar103._4_4_ = local_1bb0._4_4_ * auVar92._4_4_;
                      auVar103._8_4_ = local_1bb0._8_4_ * auVar92._8_4_;
                      auVar103._12_4_ = local_1bb0._12_4_ * auVar92._12_4_;
                      auVar92 = vsubps_avx(auVar134,auVar62);
                      auVar135._0_4_ = local_1ba0._0_4_ * auVar92._0_4_;
                      auVar135._4_4_ = local_1ba0._4_4_ * auVar92._4_4_;
                      auVar135._8_4_ = local_1ba0._8_4_ * auVar92._8_4_;
                      auVar135._12_4_ = local_1ba0._12_4_ * auVar92._12_4_;
                      auVar92 = vsubps_avx(auVar166,auVar64);
                      auVar167._0_4_ = local_1b90._0_4_ * auVar92._0_4_;
                      auVar167._4_4_ = local_1b90._4_4_ * auVar92._4_4_;
                      auVar167._8_4_ = local_1b90._8_4_ * auVar92._8_4_;
                      auVar167._12_4_ = local_1b90._12_4_ * auVar92._12_4_;
                      auVar92 = vminps_avx(auVar89,auVar103);
                      auVar85 = vminps_avx(auVar117,auVar135);
                      auVar92 = vmaxps_avx(auVar92,auVar85);
                      auVar85 = vminps_avx(auVar147,auVar167);
                      auVar92 = vmaxps_avx(auVar92,auVar85);
                      auVar179._0_4_ = auVar92._0_4_ * 0.99999964;
                      auVar179._4_4_ = auVar92._4_4_ * 0.99999964;
                      auVar179._8_4_ = auVar92._8_4_ * 0.99999964;
                      auVar179._12_4_ = auVar92._12_4_ * 0.99999964;
                      auVar92 = vmaxps_avx(auVar89,auVar103);
                      auVar85 = vmaxps_avx(auVar117,auVar135);
                      auVar85 = vminps_avx(auVar92,auVar85);
                      auVar92 = vmaxps_avx(auVar147,auVar167);
                      auVar92 = vminps_avx(auVar85,auVar92);
                      auVar90._0_4_ = auVar92._0_4_ * 1.0000004;
                      auVar90._4_4_ = auVar92._4_4_ * 1.0000004;
                      auVar90._8_4_ = auVar92._8_4_ * 1.0000004;
                      auVar90._12_4_ = auVar92._12_4_ * 1.0000004;
                      auVar92 = vmaxps_avx(auVar179,local_1b50);
                      auVar85 = vminps_avx(auVar90,local_1b40);
                      auVar92 = vcmpps_avx(auVar92,auVar85,2);
                      auVar92 = local_1d70 & auVar92;
                      local_1cc8 = uVar70;
                      if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar92 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar92 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar92[0xf]) {
                        bVar83 = false;
                        auVar92 = local_1d70;
                      }
                      else {
                        uVar1 = *(ushort *)(lVar74 + lVar71 * 8);
                        local_1ca0 = (ulong)*(uint *)(lVar74 + 0x88);
                        uVar67 = *(uint *)(lVar74 + 4 + lVar71 * 8);
                        local_1ca8 = (ulong)uVar67;
                        local_1c50 = local_1d70;
                        uVar68 = vmovmskps_avx(local_1d70);
                        local_1db8 = uVar1 & 0x7fff;
                        local_1db4 = (uint)*(ushort *)(lVar74 + 2 + lVar71 * 8);
                        local_1dbc = local_1db4 & 0x7fff;
                        local_1cb0 = (ulong)(-1 < (short)uVar1);
                        auVar92 = vpshufd_avx(ZEXT416(local_1db8),0);
                        auVar92 = vpaddd_avx(auVar92,_DAT_01f76ad0);
                        auVar85 = vpshufd_avx(ZEXT416(local_1dbc),0);
                        auVar85 = vpaddd_avx(auVar85,_DAT_01f76ae0);
                        auVar96._16_16_ = auVar92;
                        auVar96._0_16_ = auVar92;
                        _local_1860 = vcvtdq2ps_avx(auVar96);
                        auVar97._16_16_ = auVar85;
                        auVar97._0_16_ = auVar85;
                        _local_1880 = vcvtdq2ps_avx(auVar97);
                        local_1a80 = vpshufd_avx(ZEXT416(*(uint *)(lVar74 + 0x88)),0);
                        local_1a90 = vpshufd_avx(ZEXT416(uVar67),0);
                        uVar70 = local_1ca0;
                        uVar82 = CONCAT44((int)((ulong)in_R11 >> 0x20),uVar68);
                        auVar95 = local_1d20;
                        while (local_1d20 = auVar95, pRVar66 = local_1cb8, pRVar65 = local_1cc0,
                              uVar82 != 0) {
                          lVar71 = 0;
                          if (uVar82 != 0) {
                            for (; (uVar82 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
                            }
                          }
                          local_1da0._0_8_ = lVar71;
                          local_1d78 = uVar82 - 1 & uVar82;
                          local_1c88 = context->scene;
                          pGVar2 = (local_1c88->geometries).items[uVar70].ptr;
                          local_1c90 = *(long *)&pGVar2->field_0x58;
                          local_1c98 = pGVar2[1].super_RefCount.refCounter.
                                       super___atomic_base<unsigned_long>._M_i * local_1ca8;
                          fVar184 = (pGVar2->time_range).lower;
                          auVar91._4_4_ = fVar184;
                          auVar91._0_4_ = fVar184;
                          auVar91._8_4_ = fVar184;
                          auVar91._12_4_ = fVar184;
                          fVar191 = pGVar2->fnumTimeSegments;
                          auVar85 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar91);
                          auVar92 = ZEXT416((uint)((pGVar2->time_range).upper - fVar184));
                          auVar92 = vshufps_avx(auVar92,auVar92,0);
                          auVar92 = vdivps_avx(auVar85,auVar92);
                          auVar93._0_4_ = fVar191 * auVar92._0_4_;
                          auVar93._4_4_ = fVar191 * auVar92._4_4_;
                          auVar93._8_4_ = fVar191 * auVar92._8_4_;
                          auVar93._12_4_ = fVar191 * auVar92._12_4_;
                          auVar92 = vroundps_avx(auVar93,1);
                          auVar85 = vshufps_avx(ZEXT416((uint)(fVar191 + -1.0)),
                                                ZEXT416((uint)(fVar191 + -1.0)),0);
                          auVar92 = vminps_avx(auVar92,auVar85);
                          auVar92 = vmaxps_avx(auVar92,_DAT_01f45a50);
                          local_1a50 = vsubps_avx(auVar93,auVar92);
                          local_1a60 = vcvtps2dq_avx(auVar92);
                          uVar67 = *(uint *)(local_1c90 + 4 + local_1c98);
                          uVar82 = (ulong)uVar67;
                          uVar78 = (ulong)(uVar67 * local_1dbc +
                                          *(int *)(local_1c90 + local_1c98) + local_1db8);
                          lVar3 = *(long *)&pGVar2[2].numPrimitives;
                          lVar75 = (long)*(int *)(local_1a60 + lVar71 * 4) * 0x38;
                          lVar4 = *(long *)(lVar3 + lVar75);
                          lVar5 = *(long *)(lVar3 + 0x10 + lVar75);
                          auVar92 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar78);
                          lVar6 = *(long *)(lVar3 + 0x48 + lVar75);
                          auVar85 = *(undefined1 (*) [16])(lVar4 + (uVar78 + 1) * lVar5);
                          lVar74 = uVar78 + uVar82;
                          auVar111 = *(undefined1 (*) [16])(lVar4 + lVar74 * lVar5);
                          lVar81 = uVar78 + uVar82 + 1;
                          auVar100 = *(undefined1 (*) [16])(lVar4 + lVar81 * lVar5);
                          lVar72 = uVar78 + local_1cb0 + 1;
                          auVar99 = *(undefined1 (*) [16])(lVar4 + lVar72 * lVar5);
                          lVar73 = local_1cb0 + lVar81;
                          uVar70 = 0;
                          if (-1 < (short)local_1db4) {
                            uVar70 = uVar82;
                          }
                          auVar139 = *(undefined1 (*) [16])(lVar4 + lVar73 * lVar5);
                          auVar160 = *(undefined1 (*) [16])(lVar4 + (lVar74 + uVar70) * lVar5);
                          auVar174 = *(undefined1 (*) [16])(lVar4 + (lVar81 + uVar70) * lVar5);
                          auVar175 = *(undefined1 (*) [16])(lVar4 + lVar5 * (uVar70 + lVar73));
                          lVar3 = *(long *)(lVar3 + 0x38 + lVar75);
                          fVar184 = local_1a40[lVar71 + -4];
                          auVar176 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * uVar78),
                                                auVar92);
                          auVar118._0_4_ = fVar184 * auVar176._0_4_ + auVar92._0_4_;
                          auVar118._4_4_ = fVar184 * auVar176._4_4_ + auVar92._4_4_;
                          auVar118._8_4_ = fVar184 * auVar176._8_4_ + auVar92._8_4_;
                          auVar118._12_4_ = fVar184 * auVar176._12_4_ + auVar92._12_4_;
                          auVar92 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * (uVar78 + 1)),
                                               auVar85);
                          auVar218._0_4_ = fVar184 * auVar92._0_4_ + auVar85._0_4_;
                          auVar218._4_4_ = fVar184 * auVar92._4_4_ + auVar85._4_4_;
                          auVar218._8_4_ = fVar184 * auVar92._8_4_ + auVar85._8_4_;
                          auVar218._12_4_ = fVar184 * auVar92._12_4_ + auVar85._12_4_;
                          auVar92 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar74),
                                               auVar111);
                          auVar94._0_4_ = fVar184 * auVar92._0_4_ + auVar111._0_4_;
                          auVar94._4_4_ = fVar184 * auVar92._4_4_ + auVar111._4_4_;
                          auVar94._8_4_ = fVar184 * auVar92._8_4_ + auVar111._8_4_;
                          auVar94._12_4_ = fVar184 * auVar92._12_4_ + auVar111._12_4_;
                          auVar92 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar81),
                                               auVar100);
                          auVar104._0_4_ = fVar184 * auVar92._0_4_ + auVar100._0_4_;
                          auVar104._4_4_ = fVar184 * auVar92._4_4_ + auVar100._4_4_;
                          auVar104._8_4_ = fVar184 * auVar92._8_4_ + auVar100._8_4_;
                          auVar104._12_4_ = fVar184 * auVar92._12_4_ + auVar100._12_4_;
                          auVar92 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar72),
                                               auVar99);
                          auVar148._0_4_ = fVar184 * auVar92._0_4_ + auVar99._0_4_;
                          auVar148._4_4_ = fVar184 * auVar92._4_4_ + auVar99._4_4_;
                          auVar148._8_4_ = fVar184 * auVar92._8_4_ + auVar99._8_4_;
                          auVar148._12_4_ = fVar184 * auVar92._12_4_ + auVar99._12_4_;
                          auVar92 = vsubps_avx(*(undefined1 (*) [16])(lVar3 + lVar6 * lVar73),
                                               auVar139);
                          auVar168._0_4_ = fVar184 * auVar92._0_4_ + auVar139._0_4_;
                          auVar168._4_4_ = fVar184 * auVar92._4_4_ + auVar139._4_4_;
                          auVar168._8_4_ = fVar184 * auVar92._8_4_ + auVar139._8_4_;
                          auVar168._12_4_ = fVar184 * auVar92._12_4_ + auVar139._12_4_;
                          auVar92 = vsubps_avx(*(undefined1 (*) [16])
                                                (lVar3 + lVar6 * (lVar74 + uVar70)),auVar160);
                          auVar136._0_4_ = auVar160._0_4_ + fVar184 * auVar92._0_4_;
                          auVar136._4_4_ = auVar160._4_4_ + fVar184 * auVar92._4_4_;
                          auVar136._8_4_ = auVar160._8_4_ + fVar184 * auVar92._8_4_;
                          auVar136._12_4_ = auVar160._12_4_ + fVar184 * auVar92._12_4_;
                          auVar92 = vsubps_avx(*(undefined1 (*) [16])
                                                (lVar3 + lVar6 * (lVar81 + uVar70)),auVar174);
                          auVar180._0_4_ = auVar174._0_4_ + fVar184 * auVar92._0_4_;
                          auVar180._4_4_ = auVar174._4_4_ + fVar184 * auVar92._4_4_;
                          auVar180._8_4_ = auVar174._8_4_ + fVar184 * auVar92._8_4_;
                          auVar180._12_4_ = auVar174._12_4_ + fVar184 * auVar92._12_4_;
                          auVar92 = vsubps_avx(*(undefined1 (*) [16])
                                                (lVar3 + (uVar70 + lVar73) * lVar6),auVar175);
                          auVar189._0_4_ = auVar175._0_4_ + fVar184 * auVar92._0_4_;
                          auVar189._4_4_ = auVar175._4_4_ + fVar184 * auVar92._4_4_;
                          auVar189._8_4_ = auVar175._8_4_ + fVar184 * auVar92._8_4_;
                          auVar189._12_4_ = auVar175._12_4_ + fVar184 * auVar92._12_4_;
                          auVar100 = vunpcklps_avx(auVar118,auVar104);
                          auVar92 = vunpckhps_avx(auVar118,auVar104);
                          auVar99 = vunpcklps_avx(auVar218,auVar94);
                          auVar85 = vunpckhps_avx(auVar218,auVar94);
                          auVar139 = vunpcklps_avx(auVar92,auVar85);
                          auVar160 = vunpcklps_avx(auVar100,auVar99);
                          auVar92 = vunpckhps_avx(auVar100,auVar99);
                          auVar99 = vunpcklps_avx(auVar218,auVar168);
                          auVar85 = vunpckhps_avx(auVar218,auVar168);
                          auVar111 = vunpcklps_avx(auVar148,auVar104);
                          auVar100 = vunpckhps_avx(auVar148,auVar104);
                          auVar174 = vunpcklps_avx(auVar85,auVar100);
                          auVar175 = vunpcklps_avx(auVar99,auVar111);
                          auVar85 = vunpckhps_avx(auVar99,auVar111);
                          auVar111 = vunpcklps_avx(auVar104,auVar189);
                          auVar100 = vunpckhps_avx(auVar104,auVar189);
                          auVar176 = vunpcklps_avx(auVar168,auVar180);
                          auVar99 = vunpckhps_avx(auVar168,auVar180);
                          auVar204 = vunpcklps_avx(auVar100,auVar99);
                          auVar205 = vunpcklps_avx(auVar111,auVar176);
                          auVar100 = vunpckhps_avx(auVar111,auVar176);
                          auVar176 = vunpcklps_avx(auVar94,auVar180);
                          auVar99 = vunpckhps_avx(auVar94,auVar180);
                          auVar217 = vunpcklps_avx(auVar104,auVar136);
                          auVar111 = vunpckhps_avx(auVar104,auVar136);
                          auVar111 = vunpcklps_avx(auVar99,auVar111);
                          auVar27 = vunpcklps_avx(auVar176,auVar217);
                          auVar99 = vunpckhps_avx(auVar176,auVar217);
                          auVar181._16_16_ = auVar205;
                          auVar181._0_16_ = auVar160;
                          auVar190._16_16_ = auVar100;
                          auVar190._0_16_ = auVar92;
                          auVar122._16_16_ = auVar204;
                          auVar122._0_16_ = auVar139;
                          auVar206._16_16_ = auVar175;
                          auVar206._0_16_ = auVar175;
                          auVar219._16_16_ = auVar85;
                          auVar219._0_16_ = auVar85;
                          auVar149._16_16_ = auVar174;
                          auVar149._0_16_ = auVar174;
                          auVar229._16_16_ = auVar27;
                          auVar229._0_16_ = auVar27;
                          auVar137._16_16_ = auVar99;
                          auVar137._0_16_ = auVar99;
                          auVar236._16_16_ = auVar111;
                          auVar236._0_16_ = auVar111;
                          uVar68 = *(undefined4 *)(local_1cc0 + lVar71 * 4);
                          auVar241._4_4_ = uVar68;
                          auVar241._0_4_ = uVar68;
                          auVar241._8_4_ = uVar68;
                          auVar241._12_4_ = uVar68;
                          auVar241._16_4_ = uVar68;
                          auVar241._20_4_ = uVar68;
                          auVar241._24_4_ = uVar68;
                          auVar241._28_4_ = uVar68;
                          uVar68 = *(undefined4 *)(local_1cc0 + lVar71 * 4 + 0x10);
                          auVar261._4_4_ = uVar68;
                          auVar261._0_4_ = uVar68;
                          auVar261._8_4_ = uVar68;
                          auVar261._12_4_ = uVar68;
                          auVar261._16_4_ = uVar68;
                          auVar261._20_4_ = uVar68;
                          auVar261._24_4_ = uVar68;
                          auVar261._28_4_ = uVar68;
                          uVar68 = *(undefined4 *)(local_1cc0 + lVar71 * 4 + 0x20);
                          auVar264._4_4_ = uVar68;
                          auVar264._0_4_ = uVar68;
                          auVar264._8_4_ = uVar68;
                          auVar264._12_4_ = uVar68;
                          auVar264._16_4_ = uVar68;
                          auVar264._20_4_ = uVar68;
                          auVar264._24_4_ = uVar68;
                          auVar264._28_4_ = uVar68;
                          local_1720 = vsubps_avx(auVar181,auVar241);
                          local_1740 = vsubps_avx(auVar190,auVar261);
                          local_1760 = vsubps_avx(auVar122,auVar264);
                          auVar121 = vsubps_avx(auVar206,auVar241);
                          auVar95 = vsubps_avx(auVar219,auVar261);
                          auVar96 = vsubps_avx(auVar149,auVar264);
                          auVar97 = vsubps_avx(auVar229,auVar241);
                          auVar22 = vsubps_avx(auVar137,auVar261);
                          auVar23 = vsubps_avx(auVar236,auVar264);
                          local_1780 = vsubps_avx(auVar97,local_1720);
                          local_17a0 = vsubps_avx(auVar22,local_1740);
                          local_17c0 = vsubps_avx(auVar23,local_1760);
                          fVar124 = local_1740._0_4_;
                          fVar184 = auVar22._0_4_ + fVar124;
                          fVar127 = local_1740._4_4_;
                          fVar191 = auVar22._4_4_ + fVar127;
                          fVar153 = local_1740._8_4_;
                          fVar193 = auVar22._8_4_ + fVar153;
                          fVar156 = local_1740._12_4_;
                          fVar195 = auVar22._12_4_ + fVar156;
                          fVar8 = local_1740._16_4_;
                          fVar197 = auVar22._16_4_ + fVar8;
                          fVar11 = local_1740._20_4_;
                          fVar199 = auVar22._20_4_ + fVar11;
                          fVar14 = local_1740._24_4_;
                          fVar201 = auVar22._24_4_ + fVar14;
                          fVar125 = local_1760._0_4_;
                          fVar215 = auVar23._0_4_ + fVar125;
                          fVar128 = local_1760._4_4_;
                          fVar221 = auVar23._4_4_ + fVar128;
                          fVar154 = local_1760._8_4_;
                          fVar222 = auVar23._8_4_ + fVar154;
                          fVar158 = local_1760._12_4_;
                          fVar223 = auVar23._12_4_ + fVar158;
                          fVar9 = local_1760._16_4_;
                          fVar224 = auVar23._16_4_ + fVar9;
                          fVar12 = local_1760._20_4_;
                          fVar225 = auVar23._20_4_ + fVar12;
                          fVar15 = local_1760._24_4_;
                          fVar226 = auVar23._24_4_ + fVar15;
                          fVar216 = local_1760._28_4_;
                          fVar227 = auVar23._28_4_ + fVar216;
                          fVar17 = local_17c0._0_4_;
                          fVar18 = local_17c0._4_4_;
                          auVar24._4_4_ = fVar191 * fVar18;
                          auVar24._0_4_ = fVar184 * fVar17;
                          fVar19 = local_17c0._8_4_;
                          auVar24._8_4_ = fVar193 * fVar19;
                          fVar20 = local_17c0._12_4_;
                          auVar24._12_4_ = fVar195 * fVar20;
                          fVar21 = local_17c0._16_4_;
                          auVar24._16_4_ = fVar197 * fVar21;
                          fVar110 = local_17c0._20_4_;
                          auVar24._20_4_ = fVar199 * fVar110;
                          fVar123 = local_17c0._24_4_;
                          auVar24._24_4_ = fVar201 * fVar123;
                          auVar24._28_4_ = auVar27._12_4_;
                          fVar271 = local_17a0._0_4_;
                          fVar273 = local_17a0._4_4_;
                          auVar25._4_4_ = fVar273 * fVar221;
                          auVar25._0_4_ = fVar271 * fVar215;
                          fVar275 = local_17a0._8_4_;
                          auVar25._8_4_ = fVar275 * fVar222;
                          fVar277 = local_17a0._12_4_;
                          auVar25._12_4_ = fVar277 * fVar223;
                          fVar279 = local_17a0._16_4_;
                          auVar25._16_4_ = fVar279 * fVar224;
                          fVar281 = local_17a0._20_4_;
                          auVar25._20_4_ = fVar281 * fVar225;
                          fVar283 = local_17a0._24_4_;
                          auVar25._24_4_ = fVar283 * fVar226;
                          auVar25._28_4_ = auVar111._12_4_;
                          auVar24 = vsubps_avx(auVar25,auVar24);
                          fVar126 = local_1720._0_4_;
                          fVar228 = auVar97._0_4_ + fVar126;
                          fVar152 = local_1720._4_4_;
                          fVar230 = auVar97._4_4_ + fVar152;
                          fVar155 = local_1720._8_4_;
                          fVar231 = auVar97._8_4_ + fVar155;
                          fVar159 = local_1720._12_4_;
                          fVar232 = auVar97._12_4_ + fVar159;
                          fVar10 = local_1720._16_4_;
                          fVar233 = auVar97._16_4_ + fVar10;
                          fVar13 = local_1720._20_4_;
                          fVar234 = auVar97._20_4_ + fVar13;
                          fVar16 = local_1720._24_4_;
                          fVar235 = auVar97._24_4_ + fVar16;
                          fVar237 = local_1780._0_4_;
                          fVar242 = local_1780._4_4_;
                          auVar26._4_4_ = fVar242 * fVar221;
                          auVar26._0_4_ = fVar237 * fVar215;
                          fVar245 = local_1780._8_4_;
                          auVar26._8_4_ = fVar245 * fVar222;
                          fVar248 = local_1780._12_4_;
                          auVar26._12_4_ = fVar248 * fVar223;
                          fVar251 = local_1780._16_4_;
                          auVar26._16_4_ = fVar251 * fVar224;
                          fVar254 = local_1780._20_4_;
                          auVar26._20_4_ = fVar254 * fVar225;
                          fVar257 = local_1780._24_4_;
                          auVar26._24_4_ = fVar257 * fVar226;
                          auVar26._28_4_ = fVar227;
                          auVar122 = local_17c0;
                          auVar29._4_4_ = fVar230 * fVar18;
                          auVar29._0_4_ = fVar228 * fVar17;
                          auVar29._8_4_ = fVar231 * fVar19;
                          auVar29._12_4_ = fVar232 * fVar20;
                          auVar29._16_4_ = fVar233 * fVar21;
                          auVar29._20_4_ = fVar234 * fVar110;
                          auVar29._24_4_ = fVar235 * fVar123;
                          auVar29._28_4_ = auVar111._12_4_;
                          auVar25 = vsubps_avx(auVar29,auVar26);
                          auVar30._4_4_ = fVar230 * fVar273;
                          auVar30._0_4_ = fVar228 * fVar271;
                          auVar30._8_4_ = fVar231 * fVar275;
                          auVar30._12_4_ = fVar232 * fVar277;
                          auVar30._16_4_ = fVar233 * fVar279;
                          auVar30._20_4_ = fVar234 * fVar281;
                          auVar30._24_4_ = fVar235 * fVar283;
                          auVar30._28_4_ = fVar227;
                          auVar31._4_4_ = fVar242 * fVar191;
                          auVar31._0_4_ = fVar237 * fVar184;
                          auVar31._8_4_ = fVar245 * fVar193;
                          auVar31._12_4_ = fVar248 * fVar195;
                          auVar31._16_4_ = fVar251 * fVar197;
                          auVar31._20_4_ = fVar254 * fVar199;
                          auVar31._24_4_ = fVar257 * fVar201;
                          auVar31._28_4_ = auVar22._28_4_ + local_1740._28_4_;
                          auVar26 = vsubps_avx(auVar31,auVar30);
                          fVar184 = *(float *)(local_1cc0 + lVar71 * 4 + 0x50);
                          local_1d40._4_4_ = fVar184;
                          local_1d40._0_4_ = fVar184;
                          local_1d40._8_4_ = fVar184;
                          local_1d40._12_4_ = fVar184;
                          local_1d40._16_4_ = fVar184;
                          local_1d40._20_4_ = fVar184;
                          local_1d40._24_4_ = fVar184;
                          local_1d40._28_4_ = fVar184;
                          fVar191 = *(float *)(local_1cc0 + lVar71 * 4 + 0x60);
                          local_1d60._4_4_ = fVar191;
                          local_1d60._0_4_ = fVar191;
                          local_1d60._8_4_ = fVar191;
                          local_1d60._12_4_ = fVar191;
                          local_1d60._16_4_ = fVar191;
                          local_1d60._20_4_ = fVar191;
                          local_1d60._24_4_ = fVar191;
                          local_1d60._28_4_ = fVar191;
                          local_1c80._4_4_ = *(undefined4 *)(local_1cc0 + lVar71 * 4 + 0x40);
                          local_1c80._0_4_ = local_1c80._4_4_;
                          fStack_1c78 = (float)local_1c80._4_4_;
                          fStack_1c74 = (float)local_1c80._4_4_;
                          fStack_1c70 = (float)local_1c80._4_4_;
                          fStack_1c6c = (float)local_1c80._4_4_;
                          fStack_1c68 = (float)local_1c80._4_4_;
                          fStack_1c64 = (float)local_1c80._4_4_;
                          local_1820._0_4_ =
                               auVar24._0_4_ * (float)local_1c80._4_4_ +
                               fVar184 * auVar25._0_4_ + auVar26._0_4_ * fVar191;
                          local_1820._4_4_ =
                               auVar24._4_4_ * (float)local_1c80._4_4_ +
                               fVar184 * auVar25._4_4_ + auVar26._4_4_ * fVar191;
                          local_1820._8_4_ =
                               auVar24._8_4_ * (float)local_1c80._4_4_ +
                               fVar184 * auVar25._8_4_ + auVar26._8_4_ * fVar191;
                          local_1820._12_4_ =
                               auVar24._12_4_ * (float)local_1c80._4_4_ +
                               fVar184 * auVar25._12_4_ + auVar26._12_4_ * fVar191;
                          local_1820._16_4_ =
                               auVar24._16_4_ * (float)local_1c80._4_4_ +
                               fVar184 * auVar25._16_4_ + auVar26._16_4_ * fVar191;
                          local_1820._20_4_ =
                               auVar24._20_4_ * (float)local_1c80._4_4_ +
                               fVar184 * auVar25._20_4_ + auVar26._20_4_ * fVar191;
                          local_1820._24_4_ =
                               auVar24._24_4_ * (float)local_1c80._4_4_ +
                               fVar184 * auVar25._24_4_ + auVar26._24_4_ * fVar191;
                          local_1820._28_4_ = auVar24._28_4_ + auVar25._28_4_ + auVar26._28_4_;
                          local_17e0 = vsubps_avx(local_1740,auVar95);
                          local_1800 = vsubps_avx(local_1760,auVar96);
                          fVar223 = auVar95._0_4_ + fVar124;
                          fVar224 = auVar95._4_4_ + fVar127;
                          fVar225 = auVar95._8_4_ + fVar153;
                          fVar226 = auVar95._12_4_ + fVar156;
                          fVar227 = auVar95._16_4_ + fVar8;
                          fVar228 = auVar95._20_4_ + fVar11;
                          fVar230 = auVar95._24_4_ + fVar14;
                          fVar195 = fVar125 + auVar96._0_4_;
                          fVar197 = fVar128 + auVar96._4_4_;
                          fVar199 = fVar154 + auVar96._8_4_;
                          fVar201 = fVar158 + auVar96._12_4_;
                          fVar215 = fVar9 + auVar96._16_4_;
                          fVar221 = fVar12 + auVar96._20_4_;
                          fVar222 = fVar15 + auVar96._24_4_;
                          fVar193 = auVar96._28_4_;
                          fVar238 = local_1800._0_4_;
                          fVar243 = local_1800._4_4_;
                          auVar32._4_4_ = fVar243 * fVar224;
                          auVar32._0_4_ = fVar238 * fVar223;
                          fVar246 = local_1800._8_4_;
                          auVar32._8_4_ = fVar246 * fVar225;
                          fVar249 = local_1800._12_4_;
                          auVar32._12_4_ = fVar249 * fVar226;
                          fVar252 = local_1800._16_4_;
                          auVar32._16_4_ = fVar252 * fVar227;
                          fVar255 = local_1800._20_4_;
                          auVar32._20_4_ = fVar255 * fVar228;
                          fVar258 = local_1800._24_4_;
                          auVar32._24_4_ = fVar258 * fVar230;
                          auVar32._28_4_ = auVar25._28_4_;
                          fVar272 = local_17e0._0_4_;
                          fVar274 = local_17e0._4_4_;
                          auVar33._4_4_ = fVar274 * fVar197;
                          auVar33._0_4_ = fVar272 * fVar195;
                          fVar276 = local_17e0._8_4_;
                          auVar33._8_4_ = fVar276 * fVar199;
                          fVar278 = local_17e0._12_4_;
                          auVar33._12_4_ = fVar278 * fVar201;
                          fVar280 = local_17e0._16_4_;
                          auVar33._16_4_ = fVar280 * fVar215;
                          fVar282 = local_17e0._20_4_;
                          auVar33._20_4_ = fVar282 * fVar221;
                          fVar284 = local_17e0._24_4_;
                          auVar33._24_4_ = fVar284 * fVar222;
                          auVar33._28_4_ = fVar216;
                          auVar24 = vsubps_avx(auVar33,auVar32);
                          auVar25 = vsubps_avx(local_1720,auVar121);
                          fVar262 = auVar25._0_4_;
                          fVar265 = auVar25._4_4_;
                          auVar34._4_4_ = fVar265 * fVar197;
                          auVar34._0_4_ = fVar262 * fVar195;
                          fVar266 = auVar25._8_4_;
                          auVar34._8_4_ = fVar266 * fVar199;
                          fVar267 = auVar25._12_4_;
                          auVar34._12_4_ = fVar267 * fVar201;
                          fVar268 = auVar25._16_4_;
                          auVar34._16_4_ = fVar268 * fVar215;
                          fVar269 = auVar25._20_4_;
                          auVar34._20_4_ = fVar269 * fVar221;
                          fVar270 = auVar25._24_4_;
                          auVar34._24_4_ = fVar270 * fVar222;
                          auVar34._28_4_ = fVar216 + fVar193;
                          fVar216 = fVar126 + auVar121._0_4_;
                          fVar195 = fVar152 + auVar121._4_4_;
                          fVar197 = fVar155 + auVar121._8_4_;
                          fVar199 = fVar159 + auVar121._12_4_;
                          fVar201 = fVar10 + auVar121._16_4_;
                          fVar215 = fVar13 + auVar121._20_4_;
                          fVar221 = fVar16 + auVar121._24_4_;
                          auVar35._4_4_ = fVar195 * fVar243;
                          auVar35._0_4_ = fVar216 * fVar238;
                          auVar35._8_4_ = fVar197 * fVar246;
                          auVar35._12_4_ = fVar199 * fVar249;
                          auVar35._16_4_ = fVar201 * fVar252;
                          auVar35._20_4_ = fVar215 * fVar255;
                          auVar35._24_4_ = fVar221 * fVar258;
                          auVar35._28_4_ = local_1800._28_4_;
                          auVar25 = vsubps_avx(auVar35,auVar34);
                          auVar36._4_4_ = fVar195 * fVar274;
                          auVar36._0_4_ = fVar216 * fVar272;
                          auVar36._8_4_ = fVar197 * fVar276;
                          auVar36._12_4_ = fVar199 * fVar278;
                          auVar36._16_4_ = fVar201 * fVar280;
                          auVar36._20_4_ = fVar215 * fVar282;
                          auVar36._24_4_ = fVar221 * fVar284;
                          auVar36._28_4_ = local_1720._28_4_ + auVar121._28_4_;
                          auVar37._4_4_ = fVar265 * fVar224;
                          auVar37._0_4_ = fVar262 * fVar223;
                          auVar37._8_4_ = fVar266 * fVar225;
                          auVar37._12_4_ = fVar267 * fVar226;
                          auVar37._16_4_ = fVar268 * fVar227;
                          auVar37._20_4_ = fVar269 * fVar228;
                          auVar37._24_4_ = fVar270 * fVar230;
                          auVar37._28_4_ = auVar95._28_4_ + local_1740._28_4_;
                          auVar26 = vsubps_avx(auVar37,auVar36);
                          fVar173 = auVar26._28_4_ + auVar25._28_4_;
                          local_1840._0_4_ =
                               (float)local_1c80._4_4_ * auVar24._0_4_ +
                               auVar26._0_4_ * fVar191 + fVar184 * auVar25._0_4_;
                          local_1840._4_4_ =
                               (float)local_1c80._4_4_ * auVar24._4_4_ +
                               auVar26._4_4_ * fVar191 + fVar184 * auVar25._4_4_;
                          local_1840._8_4_ =
                               (float)local_1c80._4_4_ * auVar24._8_4_ +
                               auVar26._8_4_ * fVar191 + fVar184 * auVar25._8_4_;
                          local_1840._12_4_ =
                               (float)local_1c80._4_4_ * auVar24._12_4_ +
                               auVar26._12_4_ * fVar191 + fVar184 * auVar25._12_4_;
                          local_1840._16_4_ =
                               (float)local_1c80._4_4_ * auVar24._16_4_ +
                               auVar26._16_4_ * fVar191 + fVar184 * auVar25._16_4_;
                          local_1840._20_4_ =
                               (float)local_1c80._4_4_ * auVar24._20_4_ +
                               auVar26._20_4_ * fVar191 + fVar184 * auVar25._20_4_;
                          local_1840._24_4_ =
                               (float)local_1c80._4_4_ * auVar24._24_4_ +
                               auVar26._24_4_ * fVar191 + fVar184 * auVar25._24_4_;
                          local_1840._28_4_ = auVar24._28_4_ + fVar173;
                          auVar24 = vsubps_avx(auVar121,auVar97);
                          fVar230 = auVar121._0_4_ + auVar97._0_4_;
                          fVar231 = auVar121._4_4_ + auVar97._4_4_;
                          fVar232 = auVar121._8_4_ + auVar97._8_4_;
                          fVar233 = auVar121._12_4_ + auVar97._12_4_;
                          fVar234 = auVar121._16_4_ + auVar97._16_4_;
                          fVar235 = auVar121._20_4_ + auVar97._20_4_;
                          fVar157 = auVar121._24_4_ + auVar97._24_4_;
                          auVar25 = vsubps_avx(auVar95,auVar22);
                          fVar222 = auVar95._0_4_ + auVar22._0_4_;
                          fVar223 = auVar95._4_4_ + auVar22._4_4_;
                          fVar224 = auVar95._8_4_ + auVar22._8_4_;
                          fVar225 = auVar95._12_4_ + auVar22._12_4_;
                          fVar226 = auVar95._16_4_ + auVar22._16_4_;
                          fVar227 = auVar95._20_4_ + auVar22._20_4_;
                          fVar228 = auVar95._24_4_ + auVar22._24_4_;
                          auVar26 = vsubps_avx(auVar96,auVar23);
                          fVar216 = auVar96._0_4_ + auVar23._0_4_;
                          fVar195 = auVar96._4_4_ + auVar23._4_4_;
                          fVar197 = auVar96._8_4_ + auVar23._8_4_;
                          fVar199 = auVar96._12_4_ + auVar23._12_4_;
                          fVar201 = auVar96._16_4_ + auVar23._16_4_;
                          fVar215 = auVar96._20_4_ + auVar23._20_4_;
                          fVar221 = auVar96._24_4_ + auVar23._24_4_;
                          fVar203 = auVar26._0_4_;
                          fVar209 = auVar26._4_4_;
                          auVar38._4_4_ = fVar209 * fVar223;
                          auVar38._0_4_ = fVar203 * fVar222;
                          fVar210 = auVar26._8_4_;
                          auVar38._8_4_ = fVar210 * fVar224;
                          fVar211 = auVar26._12_4_;
                          auVar38._12_4_ = fVar211 * fVar225;
                          fVar212 = auVar26._16_4_;
                          auVar38._16_4_ = fVar212 * fVar226;
                          fVar213 = auVar26._20_4_;
                          auVar38._20_4_ = fVar213 * fVar227;
                          fVar214 = auVar26._24_4_;
                          auVar38._24_4_ = fVar214 * fVar228;
                          auVar38._28_4_ = fVar193;
                          fVar239 = auVar25._0_4_;
                          fVar244 = auVar25._4_4_;
                          auVar39._4_4_ = fVar244 * fVar195;
                          auVar39._0_4_ = fVar239 * fVar216;
                          fVar247 = auVar25._8_4_;
                          auVar39._8_4_ = fVar247 * fVar197;
                          fVar250 = auVar25._12_4_;
                          auVar39._12_4_ = fVar250 * fVar199;
                          fVar253 = auVar25._16_4_;
                          auVar39._16_4_ = fVar253 * fVar201;
                          fVar256 = auVar25._20_4_;
                          auVar39._20_4_ = fVar256 * fVar215;
                          fVar259 = auVar25._24_4_;
                          auVar39._24_4_ = fVar259 * fVar221;
                          auVar39._28_4_ = fVar173;
                          auVar96 = vsubps_avx(auVar39,auVar38);
                          fVar185 = auVar24._0_4_;
                          fVar192 = auVar24._4_4_;
                          auVar40._4_4_ = fVar192 * fVar195;
                          auVar40._0_4_ = fVar185 * fVar216;
                          fVar194 = auVar24._8_4_;
                          auVar40._8_4_ = fVar194 * fVar197;
                          fVar196 = auVar24._12_4_;
                          auVar40._12_4_ = fVar196 * fVar199;
                          fVar198 = auVar24._16_4_;
                          auVar40._16_4_ = fVar198 * fVar201;
                          fVar200 = auVar24._20_4_;
                          auVar40._20_4_ = fVar200 * fVar215;
                          fVar202 = auVar24._24_4_;
                          auVar40._24_4_ = fVar202 * fVar221;
                          auVar40._28_4_ = fVar193 + auVar23._28_4_;
                          auVar23._4_4_ = fVar209 * fVar231;
                          auVar23._0_4_ = fVar203 * fVar230;
                          auVar23._8_4_ = fVar210 * fVar232;
                          auVar23._12_4_ = fVar211 * fVar233;
                          auVar23._16_4_ = fVar212 * fVar234;
                          auVar23._20_4_ = fVar213 * fVar235;
                          auVar23._24_4_ = fVar214 * fVar157;
                          auVar23._28_4_ = fVar173;
                          auVar23 = vsubps_avx(auVar23,auVar40);
                          auVar41._4_4_ = fVar244 * fVar231;
                          auVar41._0_4_ = fVar239 * fVar230;
                          auVar41._8_4_ = fVar247 * fVar232;
                          auVar41._12_4_ = fVar250 * fVar233;
                          auVar41._16_4_ = fVar253 * fVar234;
                          auVar41._20_4_ = fVar256 * fVar235;
                          auVar41._24_4_ = fVar259 * fVar157;
                          auVar41._28_4_ = auVar121._28_4_ + auVar97._28_4_;
                          auVar42._4_4_ = fVar192 * fVar223;
                          auVar42._0_4_ = fVar185 * fVar222;
                          auVar42._8_4_ = fVar194 * fVar224;
                          auVar42._12_4_ = fVar196 * fVar225;
                          auVar42._16_4_ = fVar198 * fVar226;
                          auVar42._20_4_ = fVar200 * fVar227;
                          auVar42._24_4_ = fVar202 * fVar228;
                          auVar42._28_4_ = auVar95._28_4_ + auVar22._28_4_;
                          auVar121 = vsubps_avx(auVar42,auVar41);
                          auVar108._0_4_ =
                               (float)local_1c80._4_4_ * auVar96._0_4_ +
                               auVar121._0_4_ * fVar191 + fVar184 * auVar23._0_4_;
                          auVar108._4_4_ =
                               (float)local_1c80._4_4_ * auVar96._4_4_ +
                               auVar121._4_4_ * fVar191 + fVar184 * auVar23._4_4_;
                          auVar108._8_4_ =
                               (float)local_1c80._4_4_ * auVar96._8_4_ +
                               auVar121._8_4_ * fVar191 + fVar184 * auVar23._8_4_;
                          auVar108._12_4_ =
                               (float)local_1c80._4_4_ * auVar96._12_4_ +
                               auVar121._12_4_ * fVar191 + fVar184 * auVar23._12_4_;
                          auVar108._16_4_ =
                               (float)local_1c80._4_4_ * auVar96._16_4_ +
                               auVar121._16_4_ * fVar191 + fVar184 * auVar23._16_4_;
                          auVar108._20_4_ =
                               (float)local_1c80._4_4_ * auVar96._20_4_ +
                               auVar121._20_4_ * fVar191 + fVar184 * auVar23._20_4_;
                          auVar108._24_4_ =
                               (float)local_1c80._4_4_ * auVar96._24_4_ +
                               auVar121._24_4_ * fVar191 + fVar184 * auVar23._24_4_;
                          auVar108._28_4_ = auVar121._28_4_ + auVar121._28_4_ + auVar23._28_4_;
                          local_1d20._0_4_ = auVar108._0_4_ + local_1820._0_4_ + local_1840._0_4_;
                          local_1d20._4_4_ = auVar108._4_4_ + local_1820._4_4_ + local_1840._4_4_;
                          local_1d20._8_4_ = auVar108._8_4_ + local_1820._8_4_ + local_1840._8_4_;
                          local_1d20._12_4_ =
                               auVar108._12_4_ + local_1820._12_4_ + local_1840._12_4_;
                          local_1d20._16_4_ =
                               auVar108._16_4_ + local_1820._16_4_ + local_1840._16_4_;
                          local_1d20._20_4_ =
                               auVar108._20_4_ + local_1820._20_4_ + local_1840._20_4_;
                          local_1d20._24_4_ =
                               auVar108._24_4_ + local_1820._24_4_ + local_1840._24_4_;
                          local_1d20._28_4_ =
                               auVar108._28_4_ + local_1820._28_4_ + local_1840._28_4_;
                          auVar121 = vminps_avx(local_1820,local_1840);
                          auVar121 = vminps_avx(auVar121,auVar108);
                          auVar150._8_4_ = 0x7fffffff;
                          auVar150._0_8_ = 0x7fffffff7fffffff;
                          auVar150._12_4_ = 0x7fffffff;
                          auVar150._16_4_ = 0x7fffffff;
                          auVar150._20_4_ = 0x7fffffff;
                          auVar150._24_4_ = 0x7fffffff;
                          auVar150._28_4_ = 0x7fffffff;
                          local_18a0 = vandps_avx(local_1d20,auVar150);
                          fVar216 = local_18a0._0_4_ * 1.1920929e-07;
                          fVar193 = local_18a0._4_4_ * 1.1920929e-07;
                          auVar22._4_4_ = fVar193;
                          auVar22._0_4_ = fVar216;
                          fVar195 = local_18a0._8_4_ * 1.1920929e-07;
                          auVar22._8_4_ = fVar195;
                          fVar197 = local_18a0._12_4_ * 1.1920929e-07;
                          auVar22._12_4_ = fVar197;
                          fVar199 = local_18a0._16_4_ * 1.1920929e-07;
                          auVar22._16_4_ = fVar199;
                          fVar201 = local_18a0._20_4_ * 1.1920929e-07;
                          auVar22._20_4_ = fVar201;
                          fVar215 = local_18a0._24_4_ * 1.1920929e-07;
                          auVar22._24_4_ = fVar215;
                          auVar22._28_4_ = 0x34000000;
                          auVar170._0_8_ = CONCAT44(fVar193,fVar216) ^ 0x8000000080000000;
                          auVar170._8_4_ = -fVar195;
                          auVar170._12_4_ = -fVar197;
                          auVar170._16_4_ = -fVar199;
                          auVar170._20_4_ = -fVar201;
                          auVar170._24_4_ = -fVar215;
                          auVar170._28_4_ = 0xb4000000;
                          auVar121 = vcmpps_avx(auVar121,auVar170,5);
                          auVar97 = vmaxps_avx(local_1820,local_1840);
                          auVar96 = vmaxps_avx(auVar97,auVar108);
                          auVar96 = vcmpps_avx(auVar96,auVar22,2);
                          auVar121 = vorps_avx(auVar121,auVar96);
                          lVar74 = local_1d80;
                          uVar70 = local_1ca0;
                          pauVar77 = local_1dd8;
                          NVar79.ptr = local_1dd0.ptr;
                          uVar82 = local_1d78;
                          puVar80 = local_1dc8;
                          ray = pRVar65;
                          context = pRVar66;
                          local_17c0 = auVar122;
                          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar121 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar121 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar121 >> 0x7f,0) != '\0') ||
                                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar121 >> 0xbf,0) != '\0') ||
                              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar121[0x1f] < '\0') {
                            auVar43._4_4_ = fVar274 * fVar18;
                            auVar43._0_4_ = fVar272 * fVar17;
                            auVar43._8_4_ = fVar276 * fVar19;
                            auVar43._12_4_ = fVar278 * fVar20;
                            auVar43._16_4_ = fVar280 * fVar21;
                            auVar43._20_4_ = fVar282 * fVar110;
                            auVar43._24_4_ = fVar284 * fVar123;
                            auVar43._28_4_ = auVar96._28_4_;
                            auVar44._4_4_ = fVar243 * fVar273;
                            auVar44._0_4_ = fVar238 * fVar271;
                            auVar44._8_4_ = fVar246 * fVar275;
                            auVar44._12_4_ = fVar249 * fVar277;
                            auVar44._16_4_ = fVar252 * fVar279;
                            auVar44._20_4_ = fVar255 * fVar281;
                            auVar44._24_4_ = fVar258 * fVar283;
                            auVar44._28_4_ = 0x34000000;
                            auVar22 = vsubps_avx(auVar44,auVar43);
                            auVar45._4_4_ = fVar244 * fVar243;
                            auVar45._0_4_ = fVar239 * fVar238;
                            auVar45._8_4_ = fVar247 * fVar246;
                            auVar45._12_4_ = fVar250 * fVar249;
                            auVar45._16_4_ = fVar253 * fVar252;
                            auVar45._20_4_ = fVar256 * fVar255;
                            auVar45._24_4_ = fVar259 * fVar258;
                            auVar45._28_4_ = auVar97._28_4_;
                            auVar46._4_4_ = fVar274 * fVar209;
                            auVar46._0_4_ = fVar272 * fVar203;
                            auVar46._8_4_ = fVar276 * fVar210;
                            auVar46._12_4_ = fVar278 * fVar211;
                            auVar46._16_4_ = fVar280 * fVar212;
                            auVar46._20_4_ = fVar282 * fVar213;
                            auVar46._24_4_ = fVar284 * fVar214;
                            auVar46._28_4_ = local_1840._28_4_;
                            auVar23 = vsubps_avx(auVar46,auVar45);
                            auVar220._8_4_ = 0x7fffffff;
                            auVar220._0_8_ = 0x7fffffff7fffffff;
                            auVar220._12_4_ = 0x7fffffff;
                            auVar220._16_4_ = 0x7fffffff;
                            auVar220._20_4_ = 0x7fffffff;
                            auVar220._24_4_ = 0x7fffffff;
                            auVar220._28_4_ = 0x7fffffff;
                            auVar95 = vandps_avx(auVar220,auVar43);
                            auVar96 = vandps_avx(auVar220,auVar45);
                            auVar95 = vcmpps_avx(auVar95,auVar96,1);
                            auVar97 = vblendvps_avx(auVar23,auVar22,auVar95);
                            auVar47._4_4_ = fVar265 * fVar209;
                            auVar47._0_4_ = fVar262 * fVar203;
                            auVar47._8_4_ = fVar266 * fVar210;
                            auVar47._12_4_ = fVar267 * fVar211;
                            auVar47._16_4_ = fVar268 * fVar212;
                            auVar47._20_4_ = fVar269 * fVar213;
                            auVar47._24_4_ = fVar270 * fVar214;
                            auVar47._28_4_ = auVar22._28_4_;
                            auVar48._4_4_ = fVar265 * fVar18;
                            auVar48._0_4_ = fVar262 * fVar17;
                            auVar48._8_4_ = fVar266 * fVar19;
                            auVar48._12_4_ = fVar267 * fVar20;
                            auVar48._16_4_ = fVar268 * fVar21;
                            auVar48._20_4_ = fVar269 * fVar110;
                            auVar48._24_4_ = fVar270 * fVar123;
                            auVar48._28_4_ = auVar96._28_4_;
                            auVar49._4_4_ = fVar242 * fVar243;
                            auVar49._0_4_ = fVar237 * fVar238;
                            auVar49._8_4_ = fVar245 * fVar246;
                            auVar49._12_4_ = fVar248 * fVar249;
                            auVar49._16_4_ = fVar251 * fVar252;
                            auVar49._20_4_ = fVar254 * fVar255;
                            auVar49._24_4_ = fVar257 * fVar258;
                            auVar49._28_4_ = auVar23._28_4_;
                            auVar23 = vsubps_avx(auVar48,auVar49);
                            auVar50._4_4_ = fVar243 * fVar192;
                            auVar50._0_4_ = fVar238 * fVar185;
                            auVar50._8_4_ = fVar246 * fVar194;
                            auVar50._12_4_ = fVar249 * fVar196;
                            auVar50._16_4_ = fVar252 * fVar198;
                            auVar50._20_4_ = fVar255 * fVar200;
                            auVar50._24_4_ = fVar258 * fVar202;
                            auVar50._28_4_ = auVar26._28_4_;
                            auVar22 = vsubps_avx(auVar50,auVar47);
                            auVar95 = vandps_avx(auVar220,auVar49);
                            auVar96 = vandps_avx(auVar220,auVar47);
                            auVar96 = vcmpps_avx(auVar95,auVar96,1);
                            auVar22 = vblendvps_avx(auVar22,auVar23,auVar96);
                            auVar51._4_4_ = fVar274 * fVar192;
                            auVar51._0_4_ = fVar272 * fVar185;
                            auVar51._8_4_ = fVar276 * fVar194;
                            auVar51._12_4_ = fVar278 * fVar196;
                            auVar51._16_4_ = fVar280 * fVar198;
                            auVar51._20_4_ = fVar282 * fVar200;
                            auVar51._24_4_ = fVar284 * fVar202;
                            auVar51._28_4_ = auVar96._28_4_;
                            auVar52._4_4_ = fVar242 * fVar274;
                            auVar52._0_4_ = fVar237 * fVar272;
                            auVar52._8_4_ = fVar245 * fVar276;
                            auVar52._12_4_ = fVar248 * fVar278;
                            auVar52._16_4_ = fVar251 * fVar280;
                            auVar52._20_4_ = fVar254 * fVar282;
                            auVar52._24_4_ = fVar257 * fVar284;
                            auVar52._28_4_ = auVar23._28_4_;
                            auVar53._4_4_ = fVar265 * fVar273;
                            auVar53._0_4_ = fVar262 * fVar271;
                            auVar53._8_4_ = fVar266 * fVar275;
                            auVar53._12_4_ = fVar267 * fVar277;
                            auVar53._16_4_ = fVar268 * fVar279;
                            auVar53._20_4_ = fVar269 * fVar281;
                            auVar53._24_4_ = fVar270 * fVar283;
                            auVar53._28_4_ = auVar95._28_4_;
                            auVar54._4_4_ = fVar265 * fVar244;
                            auVar54._0_4_ = fVar262 * fVar239;
                            auVar54._8_4_ = fVar266 * fVar247;
                            auVar54._12_4_ = fVar267 * fVar250;
                            auVar54._16_4_ = fVar268 * fVar253;
                            auVar54._20_4_ = fVar269 * fVar256;
                            auVar54._24_4_ = fVar270 * fVar259;
                            auVar54._28_4_ = local_17c0._28_4_;
                            auVar23 = vsubps_avx(auVar52,auVar53);
                            auVar26 = vsubps_avx(auVar54,auVar51);
                            auVar95 = vandps_avx(auVar220,auVar53);
                            auVar96 = vandps_avx(auVar220,auVar51);
                            auVar96 = vcmpps_avx(auVar95,auVar96,1);
                            auVar96 = vblendvps_avx(auVar26,auVar23,auVar96);
                            auVar92 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
                            fVar110 = auVar96._0_4_;
                            fVar123 = auVar96._4_4_;
                            fVar195 = auVar96._8_4_;
                            fVar197 = auVar96._12_4_;
                            fVar199 = auVar96._16_4_;
                            fVar201 = auVar96._20_4_;
                            fVar215 = auVar96._24_4_;
                            fVar227 = auVar22._0_4_;
                            fVar228 = auVar22._4_4_;
                            fVar230 = auVar22._8_4_;
                            fVar231 = auVar22._12_4_;
                            fVar232 = auVar22._16_4_;
                            fVar233 = auVar22._20_4_;
                            fVar234 = auVar22._24_4_;
                            fVar216 = auVar97._0_4_;
                            fVar193 = auVar97._4_4_;
                            fVar17 = auVar97._8_4_;
                            fVar18 = auVar97._12_4_;
                            fVar19 = auVar97._16_4_;
                            fVar20 = auVar97._20_4_;
                            fVar21 = auVar97._24_4_;
                            fVar221 = (float)local_1c80._4_4_ * fVar216 +
                                      fVar110 * fVar191 + fVar227 * fVar184;
                            fVar222 = (float)local_1c80._4_4_ * fVar193 +
                                      fVar123 * fVar191 + fVar228 * fVar184;
                            fVar223 = (float)local_1c80._4_4_ * fVar17 +
                                      fVar195 * fVar191 + fVar230 * fVar184;
                            fVar224 = (float)local_1c80._4_4_ * fVar18 +
                                      fVar197 * fVar191 + fVar231 * fVar184;
                            fVar225 = (float)local_1c80._4_4_ * fVar19 +
                                      fVar199 * fVar191 + fVar232 * fVar184;
                            fVar226 = (float)local_1c80._4_4_ * fVar20 +
                                      fVar201 * fVar191 + fVar233 * fVar184;
                            fVar184 = (float)local_1c80._4_4_ * fVar21 +
                                      fVar215 * fVar191 + fVar234 * fVar184;
                            fVar191 = auVar121._28_4_ + 0.0 + 0.0;
                            auVar138._0_4_ = fVar221 + fVar221;
                            auVar138._4_4_ = fVar222 + fVar222;
                            auVar138._8_4_ = fVar223 + fVar223;
                            auVar138._12_4_ = fVar224 + fVar224;
                            auVar138._16_4_ = fVar225 + fVar225;
                            auVar138._20_4_ = fVar226 + fVar226;
                            auVar138._24_4_ = fVar184 + fVar184;
                            auVar138._28_4_ = fVar191 + fVar191;
                            fVar221 = fVar216 * fVar126 + fVar110 * fVar125 + fVar227 * fVar124;
                            fVar152 = fVar193 * fVar152 + fVar123 * fVar128 + fVar228 * fVar127;
                            fVar153 = fVar17 * fVar155 + fVar195 * fVar154 + fVar230 * fVar153;
                            fVar154 = fVar18 * fVar159 + fVar197 * fVar158 + fVar231 * fVar156;
                            fVar155 = fVar19 * fVar10 + fVar199 * fVar9 + fVar232 * fVar8;
                            fVar156 = fVar20 * fVar13 + fVar201 * fVar12 + fVar233 * fVar11;
                            fVar158 = fVar21 * fVar16 + fVar215 * fVar15 + fVar234 * fVar14;
                            fVar159 = auVar95._28_4_ + auVar95._28_4_ + 0.0;
                            auVar95 = vrcpps_avx(auVar138);
                            fVar184 = auVar95._0_4_;
                            fVar191 = auVar95._4_4_;
                            auVar55._4_4_ = auVar138._4_4_ * fVar191;
                            auVar55._0_4_ = auVar138._0_4_ * fVar184;
                            fVar124 = auVar95._8_4_;
                            auVar55._8_4_ = auVar138._8_4_ * fVar124;
                            fVar125 = auVar95._12_4_;
                            auVar55._12_4_ = auVar138._12_4_ * fVar125;
                            fVar126 = auVar95._16_4_;
                            auVar55._16_4_ = auVar138._16_4_ * fVar126;
                            fVar127 = auVar95._20_4_;
                            auVar55._20_4_ = auVar138._20_4_ * fVar127;
                            fVar128 = auVar95._24_4_;
                            auVar55._24_4_ = auVar138._24_4_ * fVar128;
                            auVar55._28_4_ = auVar24._28_4_;
                            auVar207._8_4_ = 0x3f800000;
                            auVar207._0_8_ = 0x3f8000003f800000;
                            auVar207._12_4_ = 0x3f800000;
                            auVar207._16_4_ = 0x3f800000;
                            auVar207._20_4_ = 0x3f800000;
                            auVar207._24_4_ = 0x3f800000;
                            auVar207._28_4_ = 0x3f800000;
                            auVar95 = vsubps_avx(auVar207,auVar55);
                            auVar56._4_4_ =
                                 (fVar152 + fVar152) * (fVar191 + fVar191 * auVar95._4_4_);
                            auVar56._0_4_ =
                                 (fVar221 + fVar221) * (fVar184 + fVar184 * auVar95._0_4_);
                            auVar56._8_4_ =
                                 (fVar153 + fVar153) * (fVar124 + fVar124 * auVar95._8_4_);
                            auVar56._12_4_ =
                                 (fVar154 + fVar154) * (fVar125 + fVar125 * auVar95._12_4_);
                            auVar56._16_4_ =
                                 (fVar155 + fVar155) * (fVar126 + fVar126 * auVar95._16_4_);
                            auVar56._20_4_ =
                                 (fVar156 + fVar156) * (fVar127 + fVar127 * auVar95._20_4_);
                            auVar56._24_4_ =
                                 (fVar158 + fVar158) * (fVar128 + fVar128 * auVar95._24_4_);
                            auVar56._28_4_ = fVar159 + fVar159;
                            uVar68 = *(undefined4 *)(local_1cc0 + lVar71 * 4 + 0x30);
                            auVar182._4_4_ = uVar68;
                            auVar182._0_4_ = uVar68;
                            auVar182._8_4_ = uVar68;
                            auVar182._12_4_ = uVar68;
                            auVar182._16_4_ = uVar68;
                            auVar182._20_4_ = uVar68;
                            auVar182._24_4_ = uVar68;
                            auVar182._28_4_ = uVar68;
                            auVar95 = vcmpps_avx(auVar182,auVar56,2);
                            uVar68 = *(undefined4 *)(local_1cc0 + lVar71 * 4 + 0x80);
                            auVar208._4_4_ = uVar68;
                            auVar208._0_4_ = uVar68;
                            auVar208._8_4_ = uVar68;
                            auVar208._12_4_ = uVar68;
                            auVar208._16_4_ = uVar68;
                            auVar208._20_4_ = uVar68;
                            auVar208._24_4_ = uVar68;
                            auVar208._28_4_ = uVar68;
                            auVar109 = ZEXT3264(auVar208);
                            auVar121 = vcmpps_avx(auVar56,auVar208,2);
                            auVar95 = vandps_avx(auVar121,auVar95);
                            auVar85 = vpackssdw_avx(auVar95._0_16_,auVar95._16_16_);
                            auVar92 = vpand_avx(auVar85,auVar92);
                            auVar85 = vpmovsxwd_avx(auVar92);
                            auVar100 = vpshufd_avx(auVar92,0xee);
                            auVar100 = vpmovsxwd_avx(auVar100);
                            auVar183._16_16_ = auVar100;
                            auVar183._0_16_ = auVar85;
                            auVar95 = local_1d20;
                            if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0 ||
                                     (auVar183 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar183 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar183 >> 0x7f,0) != '\0') ||
                                  (auVar183 & (undefined1  [32])0x100000000) !=
                                  (undefined1  [32])0x0) || SUB161(auVar100 >> 0x3f,0) != '\0') ||
                                (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                                || auVar100[0xf] < '\0') {
                              auVar121 = vcmpps_avx(auVar138,_DAT_01f7b000,4);
                              auVar85 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
                              auVar92 = vpand_avx(auVar92,auVar85);
                              auVar85 = vpmovsxwd_avx(auVar92);
                              auVar100 = vpunpckhwd_avx(auVar92,auVar92);
                              auVar171._16_16_ = auVar100;
                              auVar171._0_16_ = auVar85;
                              if ((((((((auVar171 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar171 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar171 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar171 >> 0x7f,0) != '\0')
                                    || (auVar171 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB161(auVar100 >> 0x3f,0) != '\0')
                                  || (auVar171 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar100[0xf] < '\0') {
                                local_1a00 = local_1d20;
                                local_19e0 = &local_1dd9;
                                local_19c0 = auVar171;
                                local_1960 = auVar56;
                                auVar121 = vsubps_avx(local_1d20,local_1840);
                                auVar121 = vblendvps_avx(local_1820,auVar121,local_18c0);
                                auVar96 = vsubps_avx(local_1d20,local_1820);
                                uStack_1924 = auVar97._28_4_;
                                local_1940[0] = (float)local_18e0._0_4_ * fVar216;
                                local_1940[1] = (float)local_18e0._4_4_ * fVar193;
                                local_1940[2] = fStack_18d8 * fVar17;
                                local_1940[3] = fStack_18d4 * fVar18;
                                fStack_1930 = fStack_18d0 * fVar19;
                                fStack_192c = fStack_18cc * fVar20;
                                fStack_1928 = fStack_18c8 * fVar21;
                                local_1920[0] = fVar227 * (float)local_18e0._0_4_;
                                local_1920[1] = fVar228 * (float)local_18e0._4_4_;
                                local_1920[2] = fVar230 * fStack_18d8;
                                local_1920[3] = fVar231 * fStack_18d4;
                                fStack_1910 = fVar232 * fStack_18d0;
                                fStack_190c = fVar233 * fStack_18cc;
                                fStack_1908 = fVar234 * fStack_18c8;
                                uStack_1904 = uStack_1924;
                                local_1900[0] = (float)local_18e0._0_4_ * fVar110;
                                local_1900[1] = (float)local_18e0._4_4_ * fVar123;
                                local_1900[2] = fStack_18d8 * fVar195;
                                local_1900[3] = fStack_18d4 * fVar197;
                                fStack_18f0 = fStack_18d0 * fVar199;
                                fStack_18ec = fStack_18cc * fVar201;
                                fStack_18e8 = fStack_18c8 * fVar215;
                                uStack_18e4 = uStack_1924;
                                auVar105._0_4_ =
                                     (float)(int)(*(ushort *)(local_1c90 + 8 + local_1c98) - 1);
                                auVar105._4_12_ = auVar25._4_12_;
                                auVar96 = vblendvps_avx(local_1840,auVar96,local_18c0);
                                auVar85 = vrcpss_avx(auVar105,auVar105);
                                auVar169._0_4_ =
                                     (float)(int)(*(ushort *)(local_1c90 + 10 + local_1c98) - 1);
                                auVar169._4_12_ = auVar25._4_12_;
                                auVar100 = vrcpss_avx(auVar169,auVar169);
                                auVar85 = ZEXT416((uint)(auVar85._0_4_ *
                                                        (2.0 - auVar85._0_4_ * auVar105._0_4_)));
                                auVar85 = vshufps_avx(auVar85,auVar85,0);
                                local_1a40[0] =
                                     (local_1d20._0_4_ * (float)local_1860._0_4_ + auVar121._0_4_) *
                                     auVar85._0_4_;
                                local_1a40[1] =
                                     (local_1d20._4_4_ * (float)local_1860._4_4_ + auVar121._4_4_) *
                                     auVar85._4_4_;
                                local_1a40[2] =
                                     (local_1d20._8_4_ * fStack_1858 + auVar121._8_4_) *
                                     auVar85._8_4_;
                                fStack_1a24 = auVar85._12_4_;
                                local_1a40[3] =
                                     (local_1d20._12_4_ * fStack_1854 + auVar121._12_4_) *
                                     fStack_1a24;
                                fStack_1a30 = (local_1d20._16_4_ * fStack_1850 + auVar121._16_4_) *
                                              auVar85._0_4_;
                                fStack_1a2c = (local_1d20._20_4_ * fStack_184c + auVar121._20_4_) *
                                              auVar85._4_4_;
                                fStack_1a28 = (local_1d20._24_4_ * fStack_1848 + auVar121._24_4_) *
                                              auVar85._8_4_;
                                auVar85 = ZEXT416((uint)(auVar100._0_4_ *
                                                        (2.0 - auVar100._0_4_ * auVar169._0_4_)));
                                auVar85 = vshufps_avx(auVar85,auVar85,0);
                                fVar184 = (local_1d20._0_4_ * (float)local_1880._0_4_ +
                                          auVar96._0_4_) * auVar85._0_4_;
                                fVar191 = (local_1d20._4_4_ * (float)local_1880._4_4_ +
                                          auVar96._4_4_) * auVar85._4_4_;
                                local_1a20._4_4_ = fVar191;
                                local_1a20._0_4_ = fVar184;
                                fVar124 = (local_1d20._8_4_ * fStack_1878 + auVar96._8_4_) *
                                          auVar85._8_4_;
                                local_1a20._8_4_ = fVar124;
                                fVar125 = (local_1d20._12_4_ * fStack_1874 + auVar96._12_4_) *
                                          auVar85._12_4_;
                                local_1a20._12_4_ = fVar125;
                                fVar126 = (local_1d20._16_4_ * fStack_1870 + auVar96._16_4_) *
                                          auVar85._0_4_;
                                local_1a20._16_4_ = fVar126;
                                fVar127 = (local_1d20._20_4_ * fStack_186c + auVar96._20_4_) *
                                          auVar85._4_4_;
                                local_1a20._20_4_ = fVar127;
                                fVar128 = (local_1d20._24_4_ * fStack_1868 + auVar96._24_4_) *
                                          auVar85._8_4_;
                                local_1a20._24_4_ = fVar128;
                                local_1a20._28_4_ = auVar121._28_4_ + 0.0 + auVar96._28_4_;
                                pGVar2 = (local_1c88->geometries).items[local_1ca0].ptr;
                                if ((pGVar2->mask & *(uint *)(local_1cc0 + lVar71 * 4 + 0x90)) != 0)
                                {
                                  if ((local_1cb8->args->filter == (RTCFilterFunctionN)0x0) &&
                                     (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00ed5d3f:
                                    *(undefined4 *)(local_1c50 + lVar71 * 4) = 0;
                                    lVar74 = local_1d80;
                                    pauVar77 = local_1dd8;
                                    NVar79.ptr = local_1dd0.ptr;
                                    uVar82 = local_1d78;
                                    auVar95 = local_1d20;
                                  }
                                  else {
                                    auVar95 = vrcpps_avx(local_1d20);
                                    fVar152 = auVar95._0_4_;
                                    fVar153 = auVar95._4_4_;
                                    auVar57._4_4_ = local_1d20._4_4_ * fVar153;
                                    auVar57._0_4_ = local_1d20._0_4_ * fVar152;
                                    fVar154 = auVar95._8_4_;
                                    auVar57._8_4_ = local_1d20._8_4_ * fVar154;
                                    fVar155 = auVar95._12_4_;
                                    auVar57._12_4_ = local_1d20._12_4_ * fVar155;
                                    fVar156 = auVar95._16_4_;
                                    auVar57._16_4_ = local_1d20._16_4_ * fVar156;
                                    fVar158 = auVar95._20_4_;
                                    auVar57._20_4_ = local_1d20._20_4_ * fVar158;
                                    fVar159 = auVar95._24_4_;
                                    auVar57._24_4_ = local_1d20._24_4_ * fVar159;
                                    auVar57._28_4_ = local_1d20._28_4_;
                                    auVar172._8_4_ = 0x3f800000;
                                    auVar172._0_8_ = 0x3f8000003f800000;
                                    auVar172._12_4_ = 0x3f800000;
                                    auVar172._16_4_ = 0x3f800000;
                                    auVar172._20_4_ = 0x3f800000;
                                    auVar172._24_4_ = 0x3f800000;
                                    auVar172._28_4_ = 0x3f800000;
                                    auVar121 = vsubps_avx(auVar172,auVar57);
                                    auVar98._0_4_ = fVar152 + fVar152 * auVar121._0_4_;
                                    auVar98._4_4_ = fVar153 + fVar153 * auVar121._4_4_;
                                    auVar98._8_4_ = fVar154 + fVar154 * auVar121._8_4_;
                                    auVar98._12_4_ = fVar155 + fVar155 * auVar121._12_4_;
                                    auVar98._16_4_ = fVar156 + fVar156 * auVar121._16_4_;
                                    auVar98._20_4_ = fVar158 + fVar158 * auVar121._20_4_;
                                    auVar98._24_4_ = fVar159 + fVar159 * auVar121._24_4_;
                                    auVar98._28_4_ = auVar95._28_4_ + auVar121._28_4_;
                                    auVar151._8_4_ = 0x219392ef;
                                    auVar151._0_8_ = 0x219392ef219392ef;
                                    auVar151._12_4_ = 0x219392ef;
                                    auVar151._16_4_ = 0x219392ef;
                                    auVar151._20_4_ = 0x219392ef;
                                    auVar151._24_4_ = 0x219392ef;
                                    auVar151._28_4_ = 0x219392ef;
                                    auVar95 = vcmpps_avx(local_18a0,auVar151,5);
                                    auVar95 = vandps_avx(auVar95,auVar98);
                                    auVar58._4_4_ = local_1a40[1] * auVar95._4_4_;
                                    auVar58._0_4_ = local_1a40[0] * auVar95._0_4_;
                                    auVar58._8_4_ = local_1a40[2] * auVar95._8_4_;
                                    auVar58._12_4_ = local_1a40[3] * auVar95._12_4_;
                                    auVar58._16_4_ = fStack_1a30 * auVar95._16_4_;
                                    auVar58._20_4_ = fStack_1a2c * auVar95._20_4_;
                                    auVar58._24_4_ = fStack_1a28 * auVar95._24_4_;
                                    auVar58._28_4_ = fStack_1a24;
                                    local_19a0 = vminps_avx(auVar58,auVar172);
                                    auVar59._4_4_ = fVar191 * auVar95._4_4_;
                                    auVar59._0_4_ = fVar184 * auVar95._0_4_;
                                    auVar59._8_4_ = fVar124 * auVar95._8_4_;
                                    auVar59._12_4_ = fVar125 * auVar95._12_4_;
                                    auVar59._16_4_ = fVar126 * auVar95._16_4_;
                                    auVar59._20_4_ = fVar127 * auVar95._20_4_;
                                    auVar59._24_4_ = fVar128 * auVar95._24_4_;
                                    auVar59._28_4_ = auVar95._28_4_;
                                    local_1980 = vminps_avx(auVar59,auVar172);
                                    auVar92 = vpacksswb_avx(auVar92,auVar92);
                                    bVar28 = SUB161(auVar92 >> 7,0) & 1 |
                                             (SUB161(auVar92 >> 0xf,0) & 1) << 1 |
                                             (SUB161(auVar92 >> 0x17,0) & 1) << 2 |
                                             (SUB161(auVar92 >> 0x1f,0) & 1) << 3 |
                                             (SUB161(auVar92 >> 0x27,0) & 1) << 4 |
                                             (SUB161(auVar92 >> 0x2f,0) & 1) << 5 |
                                             (SUB161(auVar92 >> 0x37,0) & 1) << 6 |
                                             SUB161(auVar92 >> 0x3f,0) << 7;
                                    uVar76 = (ulong)bVar28;
                                    uVar78 = 0;
                                    if (uVar76 != 0) {
                                      for (; (bVar28 >> uVar78 & 1) == 0; uVar78 = uVar78 + 1) {
                                      }
                                    }
                                    local_1d20._0_8_ =
                                         mm_lookupmask_ps +
                                         (long)(1 << ((byte)lVar71 & 0x1f)) * 0x10;
                                    _local_1c80 = auVar208;
                                    while (lVar74 = local_1d80, pauVar77 = local_1dd8,
                                          NVar79.ptr = local_1dd0.ptr, uVar82 = local_1d78,
                                          auVar95 = local_1d20, uVar76 != 0) {
                                      local_1b00 = *(undefined4 *)(local_19a0 + uVar78 * 4);
                                      uVar68 = *(undefined4 *)(local_1980 + uVar78 * 4);
                                      local_1af0._4_4_ = uVar68;
                                      local_1af0._0_4_ = uVar68;
                                      local_1af0._8_4_ = uVar68;
                                      local_1af0._12_4_ = uVar68;
                                      *(float *)(pRVar65 + lVar71 * 4 + 0x80) =
                                           local_1940[uVar78 - 8];
                                      local_1c40.context = pRVar66->user;
                                      local_1b30[0] = local_1940[uVar78];
                                      fVar184 = local_1920[uVar78];
                                      local_1b20._4_4_ = fVar184;
                                      local_1b20._0_4_ = fVar184;
                                      local_1b20._8_4_ = fVar184;
                                      local_1b20._12_4_ = fVar184;
                                      fVar184 = local_1900[uVar78];
                                      local_1b10._4_4_ = fVar184;
                                      local_1b10._0_4_ = fVar184;
                                      local_1b10._8_4_ = fVar184;
                                      local_1b10._12_4_ = fVar184;
                                      local_1b30[1] = local_1b30[0];
                                      local_1b30[2] = local_1b30[0];
                                      local_1b30[3] = local_1b30[0];
                                      uStack_1afc = local_1b00;
                                      uStack_1af8 = local_1b00;
                                      uStack_1af4 = local_1b00;
                                      local_1ae0 = local_1a90._0_8_;
                                      uStack_1ad8 = local_1a90._8_8_;
                                      local_1ad0 = local_1a80;
                                      vcmpps_avx(ZEXT1632(local_1a80),ZEXT1632(local_1a80),0xf);
                                      uStack_1abc = (local_1c40.context)->instID[0];
                                      local_1ac0 = uStack_1abc;
                                      uStack_1ab8 = uStack_1abc;
                                      uStack_1ab4 = uStack_1abc;
                                      uStack_1ab0 = (local_1c40.context)->instPrimID[0];
                                      uStack_1aac = uStack_1ab0;
                                      uStack_1aa8 = uStack_1ab0;
                                      uStack_1aa4 = uStack_1ab0;
                                      local_1d00 = *(undefined1 (*) [16])local_1d20._0_8_;
                                      local_1c40.valid = (int *)local_1d00;
                                      local_1c40.geometryUserPtr = pGVar2->userPtr;
                                      local_1c40.ray = (RTCRayN *)pRVar65;
                                      local_1c40.hit = (RTCHitN *)local_1b30;
                                      local_1c40.N = 4;
                                      local_1d40._0_8_ = uVar76;
                                      local_1d60._0_8_ = uVar78;
                                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                        (*pGVar2->occlusionFilterN)(&local_1c40);
                                        auVar109 = ZEXT3264(_local_1c80);
                                        lVar71 = local_1da0._0_8_;
                                        uVar76 = local_1d40._0_8_;
                                        uVar78 = local_1d60._0_8_;
                                      }
                                      if (local_1d00 == (undefined1  [16])0x0) {
                                        auVar92 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                                        auVar92 = auVar92 ^ _DAT_01f46b70;
                                      }
                                      else {
                                        p_Var7 = pRVar66->args->filter;
                                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                           (((pRVar66->args->flags &
                                             RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                                          (*p_Var7)(&local_1c40);
                                          auVar109 = ZEXT3264(_local_1c80);
                                          lVar71 = local_1da0._0_8_;
                                          uVar76 = local_1d40._0_8_;
                                          uVar78 = local_1d60._0_8_;
                                        }
                                        auVar85 = vpcmpeqd_avx(local_1d00,_DAT_01f45a50);
                                        auVar92 = auVar85 ^ _DAT_01f46b70;
                                        auVar119._8_4_ = 0xff800000;
                                        auVar119._0_8_ = 0xff800000ff800000;
                                        auVar119._12_4_ = 0xff800000;
                                        auVar85 = vblendvps_avx(auVar119,*(undefined1 (*) [16])
                                                                          (local_1c40.ray + 0x80),
                                                                auVar85);
                                        *(undefined1 (*) [16])(local_1c40.ray + 0x80) = auVar85;
                                      }
                                      auVar106._8_8_ = 0x100000001;
                                      auVar106._0_8_ = 0x100000001;
                                      if ((auVar106 & auVar92) != (undefined1  [16])0x0)
                                      goto LAB_00ed5d3f;
                                      *(int *)(local_1d88 + lVar71 * 4) = auVar109._0_4_;
                                      uVar76 = uVar76 ^ 1L << (uVar78 & 0x3f);
                                      uVar78 = 0;
                                      if (uVar76 != 0) {
                                        for (; (uVar76 >> uVar78 & 1) == 0; uVar78 = uVar78 + 1) {
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        auVar92 = local_1d70 & local_1c50;
                        bVar83 = (((auVar92 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0 &&
                                  (auVar92 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar92 >> 0x5f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) && -1 < auVar92[0xf];
                        auVar92 = vandps_avx(local_1c50,local_1d70);
                        in_R11 = 0;
                      }
                      auVar109 = ZEXT1664(local_1d70);
                      local_1d70 = auVar92;
                    } while ((!bVar83) && (uVar70 = local_1cc8 & local_1cc8 - 1, uVar70 != 0));
                  }
                  auVar92 = local_1d70;
                  lVar74 = local_1cd0 + 1;
                }
                auVar85 = vpcmpeqd_avx(auVar109._0_16_,auVar109._0_16_);
                local_1db0 = vpor_avx(auVar92 ^ auVar85,local_1db0);
                auVar85 = auVar85 & ~local_1db0;
                if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar85 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar85 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar85[0xf]) goto LAB_00ed617f;
                auVar120._8_4_ = 0xff800000;
                auVar120._0_8_ = 0xff800000ff800000;
                auVar120._12_4_ = 0xff800000;
                local_1b40 = vblendvps_avx(local_1b40,auVar120,local_1db0);
              }
              goto LAB_00ed4c1e;
            }
            uVar70 = local_1dd0.ptr & 0xfffffffffffffff0;
            auVar92 = vcmpps_avx(local_1b40,auVar109._0_16_,6);
            auVar109 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
            local_1dd0.ptr = 8;
            for (lVar74 = -0x10;
                (auVar85 = auVar109._0_16_, lVar74 != 0 &&
                (uVar82 = *(ulong *)(uVar70 + 0x20 + lVar74 * 2), uVar82 != 8)); lVar74 = lVar74 + 4
                ) {
              fVar184 = *(float *)(uVar70 + 0x90 + lVar74);
              fVar191 = *(float *)(uVar70 + 0x30 + lVar74);
              auVar100 = *(undefined1 (*) [16])(ray + 0x70);
              fVar124 = auVar100._0_4_;
              fVar125 = auVar100._4_4_;
              fVar126 = auVar100._8_4_;
              fVar127 = auVar100._12_4_;
              auVar112._0_4_ = fVar124 * fVar184 + fVar191;
              auVar112._4_4_ = fVar125 * fVar184 + fVar191;
              auVar112._8_4_ = fVar126 * fVar184 + fVar191;
              auVar112._12_4_ = fVar127 * fVar184 + fVar191;
              fVar184 = *(float *)(uVar70 + 0xb0 + lVar74);
              fVar191 = *(float *)(uVar70 + 0x50 + lVar74);
              auVar129._0_4_ = fVar124 * fVar184 + fVar191;
              auVar129._4_4_ = fVar125 * fVar184 + fVar191;
              auVar129._8_4_ = fVar126 * fVar184 + fVar191;
              auVar129._12_4_ = fVar127 * fVar184 + fVar191;
              fVar184 = *(float *)(uVar70 + 0xd0 + lVar74);
              fVar191 = *(float *)(uVar70 + 0x70 + lVar74);
              auVar140._0_4_ = fVar124 * fVar184 + fVar191;
              auVar140._4_4_ = fVar125 * fVar184 + fVar191;
              auVar140._8_4_ = fVar126 * fVar184 + fVar191;
              auVar140._12_4_ = fVar127 * fVar184 + fVar191;
              fVar184 = *(float *)(uVar70 + 0xa0 + lVar74);
              fVar191 = *(float *)(uVar70 + 0x40 + lVar74);
              auVar161._0_4_ = fVar124 * fVar184 + fVar191;
              auVar161._4_4_ = fVar125 * fVar184 + fVar191;
              auVar161._8_4_ = fVar126 * fVar184 + fVar191;
              auVar161._12_4_ = fVar127 * fVar184 + fVar191;
              fVar184 = *(float *)(uVar70 + 0xc0 + lVar74);
              fVar191 = *(float *)(uVar70 + 0x60 + lVar74);
              auVar177._0_4_ = fVar124 * fVar184 + fVar191;
              auVar177._4_4_ = fVar125 * fVar184 + fVar191;
              auVar177._8_4_ = fVar126 * fVar184 + fVar191;
              auVar177._12_4_ = fVar127 * fVar184 + fVar191;
              fVar184 = *(float *)(uVar70 + 0xe0 + lVar74);
              fVar191 = *(float *)(uVar70 + 0x80 + lVar74);
              auVar186._0_4_ = fVar191 + fVar124 * fVar184;
              auVar186._4_4_ = fVar191 + fVar125 * fVar184;
              auVar186._8_4_ = fVar191 + fVar126 * fVar184;
              auVar186._12_4_ = fVar191 + fVar127 * fVar184;
              auVar111._8_8_ = local_1c10._8_8_;
              auVar111._0_8_ = local_1c10._0_8_;
              auVar27._8_8_ = local_1c10._24_8_;
              auVar27._0_8_ = local_1c10._16_8_;
              auVar63._8_8_ = local_1c10._40_8_;
              auVar63._0_8_ = local_1c10._32_8_;
              auVar99 = vsubps_avx(auVar112,auVar111);
              auVar240._0_4_ = local_1bb0._0_4_ * auVar99._0_4_;
              auVar240._4_4_ = local_1bb0._4_4_ * auVar99._4_4_;
              auVar240._8_4_ = local_1bb0._8_4_ * auVar99._8_4_;
              auVar240._12_4_ = local_1bb0._12_4_ * auVar99._12_4_;
              auVar99 = vsubps_avx(auVar129,auVar27);
              auVar260._0_4_ = auVar99._0_4_ * (float)local_1ba0._0_4_;
              auVar260._4_4_ = auVar99._4_4_ * (float)local_1ba0._4_4_;
              auVar260._8_4_ = auVar99._8_4_ * fStack_1b98;
              auVar260._12_4_ = auVar99._12_4_ * fStack_1b94;
              auVar99 = vsubps_avx(auVar140,auVar63);
              auVar263._0_4_ = auVar99._0_4_ * (float)local_1b90._0_4_;
              auVar263._4_4_ = auVar99._4_4_ * (float)local_1b90._4_4_;
              auVar263._8_4_ = auVar99._8_4_ * fStack_1b88;
              auVar263._12_4_ = auVar99._12_4_ * fStack_1b84;
              auVar99 = vsubps_avx(auVar161,auVar111);
              auVar162._0_4_ = local_1bb0._0_4_ * auVar99._0_4_;
              auVar162._4_4_ = local_1bb0._4_4_ * auVar99._4_4_;
              auVar162._8_4_ = local_1bb0._8_4_ * auVar99._8_4_;
              auVar162._12_4_ = local_1bb0._12_4_ * auVar99._12_4_;
              auVar99 = vsubps_avx(auVar177,auVar27);
              auVar130._0_4_ = auVar99._0_4_ * (float)local_1ba0._0_4_;
              auVar130._4_4_ = auVar99._4_4_ * (float)local_1ba0._4_4_;
              auVar130._8_4_ = auVar99._8_4_ * fStack_1b98;
              auVar130._12_4_ = auVar99._12_4_ * fStack_1b94;
              auVar99 = vsubps_avx(auVar186,auVar63);
              auVar141._0_4_ = auVar99._0_4_ * (float)local_1b90._0_4_;
              auVar141._4_4_ = auVar99._4_4_ * (float)local_1b90._4_4_;
              auVar141._8_4_ = auVar99._8_4_ * fStack_1b88;
              auVar141._12_4_ = auVar99._12_4_ * fStack_1b84;
              auVar99 = vpminsd_avx(auVar240,auVar162);
              auVar111 = vpminsd_avx(auVar260,auVar130);
              auVar99 = vpmaxsd_avx(auVar99,auVar111);
              auVar111 = vpminsd_avx(auVar263,auVar141);
              auVar99 = vpmaxsd_avx(auVar99,auVar111);
              auVar113._0_4_ = auVar99._0_4_ * 0.99999964;
              auVar113._4_4_ = auVar99._4_4_ * 0.99999964;
              auVar113._8_4_ = auVar99._8_4_ * 0.99999964;
              auVar113._12_4_ = auVar99._12_4_ * 0.99999964;
              auVar99 = vpmaxsd_avx(auVar240,auVar162);
              auVar111 = vpmaxsd_avx(auVar260,auVar130);
              auVar111 = vpminsd_avx(auVar99,auVar111);
              auVar99 = vpmaxsd_avx(auVar263,auVar141);
              auVar111 = vpminsd_avx(auVar111,auVar99);
              auVar99 = vpmaxsd_avx(auVar113,local_1b50);
              auVar142._0_4_ = auVar111._0_4_ * 1.0000004;
              auVar142._4_4_ = auVar111._4_4_ * 1.0000004;
              auVar142._8_4_ = auVar111._8_4_ * 1.0000004;
              auVar142._12_4_ = auVar111._12_4_ * 1.0000004;
              auVar111 = vpminsd_avx(auVar142,local_1b40);
              if ((uVar67 & 7) == 6) {
                auVar99 = vcmpps_avx(auVar99,auVar111,2);
                uVar68 = *(undefined4 *)(uVar70 + 0xf0 + lVar74);
                auVar143._4_4_ = uVar68;
                auVar143._0_4_ = uVar68;
                auVar143._8_4_ = uVar68;
                auVar143._12_4_ = uVar68;
                auVar111 = vcmpps_avx(auVar143,auVar100,2);
                uVar68 = *(undefined4 *)(uVar70 + 0x100 + lVar74);
                auVar163._4_4_ = uVar68;
                auVar163._0_4_ = uVar68;
                auVar163._8_4_ = uVar68;
                auVar163._12_4_ = uVar68;
                auVar100 = vcmpps_avx(auVar100,auVar163,1);
                auVar100 = vandps_avx(auVar111,auVar100);
                auVar100 = vandps_avx(auVar100,auVar99);
              }
              else {
                auVar100 = vcmpps_avx(auVar99,auVar111,2);
              }
              auVar100 = vandps_avx(auVar100,auVar92);
              auVar100 = vpslld_avx(auVar100,0x1f);
              if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar100 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar100 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar100[0xf]) {
                auVar109 = ZEXT1664(auVar85);
                uVar82 = local_1dd0.ptr;
              }
              else {
                auVar131._8_4_ = 0x7f800000;
                auVar131._0_8_ = 0x7f8000007f800000;
                auVar131._12_4_ = 0x7f800000;
                auVar100 = vblendvps_avx(auVar131,auVar113,auVar100);
                auVar109 = ZEXT1664(auVar100);
                if (local_1dd0.ptr != 8) {
                  *puVar80 = local_1dd0.ptr;
                  puVar80 = puVar80 + 1;
                  *pauVar77 = auVar85;
                  pauVar77 = pauVar77 + 1;
                }
              }
              local_1dd0.ptr = uVar82;
            }
            if (local_1dd0.ptr == 8) goto LAB_00ed4ee7;
            auVar92 = vcmpps_avx(local_1b40,auVar85,6);
            uVar68 = vmovmskps_avx(auVar92);
          } while (bVar60 < (byte)POPCOUNT(uVar68));
          *puVar80 = local_1dd0.ptr;
          puVar80 = puVar80 + 1;
          *pauVar77 = auVar85;
          pauVar77 = pauVar77 + 1;
LAB_00ed4ee7:
          iVar69 = 4;
          local_1dd8 = pauVar77;
          local_1dc8 = puVar80;
        }
        else {
          while (local_1da0 = auVar92, uVar82 != 0) {
            k = 0;
            if (uVar82 != 0) {
              for (; (uVar82 >> k & 1) == 0; k = k + 1) {
              }
            }
            uVar82 = uVar82 & uVar82 - 1;
            bVar83 = occluded1(local_1ce0,local_1ce8,local_1dd0,k,&local_1dda,ray,
                               (TravRayK<4,_true> *)&local_1c10.field_0,context);
            auVar92 = local_1da0;
            if (bVar83) {
              *(undefined4 *)(local_1db0 + k * 4) = 0xffffffff;
              auVar92 = local_1da0;
            }
          }
          auVar92 = _DAT_01f46b70 & ~local_1db0;
          iVar69 = 3;
          if ((((auVar92 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar92 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar92 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar92[0xf] < '\0') {
            auVar85._8_4_ = 0xff800000;
            auVar85._0_8_ = 0xff800000ff800000;
            auVar85._12_4_ = 0xff800000;
            local_1b40 = vblendvps_avx(local_1b40,auVar85,local_1db0);
            iVar69 = 2;
          }
          puVar80 = local_1dc8;
          auVar92 = local_1da0;
          if (local_1d90 < uVar70) goto LAB_00ed4c69;
        }
        pauVar77 = local_1dd8;
        puVar80 = local_1dc8;
      } while (iVar69 != 3);
LAB_00ed617f:
      auVar92 = vandps_avx(local_1aa0,local_1db0);
      auVar107._8_4_ = 0xff800000;
      auVar107._0_8_ = 0xff800000ff800000;
      auVar107._12_4_ = 0xff800000;
      auVar92 = vmaskmovps_avx(auVar92,auVar107);
      *(undefined1 (*) [16])local_1d88 = auVar92;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }